

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

bool embree::sse2::CurveNvIntersectorK<4,4>::
     occluded_t<embree::sse2::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  Primitive *pPVar2;
  Primitive *pPVar3;
  Primitive *pPVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Primitive PVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined6 uVar37;
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  int iVar53;
  undefined4 uVar54;
  ulong uVar57;
  StackEntry *pSVar58;
  ulong extraout_RAX;
  uint uVar55;
  undefined4 uVar56;
  RTCRayN *pRVar59;
  long extraout_RAX_00;
  ulong uVar60;
  int iVar61;
  long lVar62;
  ulong uVar63;
  ulong uVar64;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  byte bVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  bool bVar69;
  uint uVar70;
  uint uVar71;
  uint uVar72;
  uint uVar73;
  uint uVar74;
  float fVar75;
  undefined8 uVar76;
  float fVar122;
  __m128 a_1;
  float fVar121;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar91 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar119;
  short sVar123;
  float pp;
  float fVar124;
  float fVar163;
  float fVar164;
  undefined1 auVar125 [16];
  undefined1 auVar128 [16];
  undefined1 auVar131 [16];
  undefined1 auVar134 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar165;
  float fVar171;
  float fVar173;
  vfloat4 a;
  undefined1 auVar166 [16];
  float fVar172;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar198;
  float fVar201;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar199;
  float fVar200;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar223;
  float fVar225;
  vfloat4 v;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar224;
  float fVar226;
  float fVar227;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar219 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar228;
  float fVar229;
  float fVar245;
  float fVar247;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar246;
  float fVar248;
  float fVar249;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar250;
  float fVar272;
  float fVar273;
  undefined1 auVar251 [16];
  undefined1 auVar254 [16];
  undefined1 auVar257 [16];
  undefined1 auVar260 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar271 [16];
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  uint uVar280;
  float fVar288;
  float fVar293;
  undefined1 auVar281 [16];
  float fVar289;
  float fVar290;
  float fVar294;
  float fVar295;
  float fVar298;
  float fVar299;
  undefined1 auVar282 [16];
  float fVar291;
  float fVar296;
  float fVar300;
  undefined1 auVar283 [16];
  float fVar301;
  undefined1 auVar284 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar285;
  uint uVar292;
  uint uVar297;
  uint uVar302;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  float fVar303;
  float fVar312;
  float fVar314;
  undefined1 auVar305 [16];
  float fVar304;
  float fVar313;
  float fVar315;
  float fVar316;
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  undefined1 auVar327 [16];
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar352;
  float fVar355;
  undefined1 auVar345 [16];
  float fVar358;
  undefined1 auVar348 [16];
  float fVar353;
  float fVar354;
  float fVar356;
  float fVar357;
  float fVar359;
  float fVar360;
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  float fVar361;
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar365;
  float fVar366;
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar372;
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  float fVar380;
  float fVar381;
  float fVar382;
  float fVar383;
  float fVar384;
  __m128 a_2;
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  uint local_6dc;
  undefined1 local_6c8 [8];
  float fStack_6c0;
  float fStack_6bc;
  undefined8 local_698;
  undefined1 local_688 [8];
  float fStack_680;
  float fStack_67c;
  undefined1 local_668 [8];
  float fStack_660;
  float fStack_65c;
  undefined1 local_5f8 [16];
  ulong local_5e0;
  undefined1 local_5d8 [8];
  float fStack_5d0;
  float fStack_5cc;
  float local_5c8;
  float fStack_5c4;
  float fStack_5c0;
  float fStack_5bc;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_5a8;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  Vec3fa dir;
  RTCFilterFunctionNArguments args;
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined4 local_2e8;
  undefined4 uStack_2e4;
  undefined4 uStack_2e0;
  undefined4 uStack_2dc;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  uint local_2b8;
  uint uStack_2b4;
  uint uStack_2b0;
  uint uStack_2ac;
  uint local_2a8;
  uint uStack_2a4;
  uint uStack_2a0;
  uint uStack_29c;
  BBox<embree::vfloat_impl<4>_> tp1;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1a8;
  float fStack_1a4;
  BBox<embree::vfloat_impl<4>_> tp0;
  float local_118 [4];
  float local_108 [4];
  StackEntry stack [4];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined2 uVar120;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 uVar162;
  undefined1 auVar218 [16];
  undefined1 auVar220 [16];
  undefined1 auVar240 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar270 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  
  PVar8 = prim[1];
  uVar57 = (ulong)(byte)PVar8;
  fVar201 = *(float *)(prim + uVar57 * 0x19 + 0x12);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar208 = (*(float *)(ray + k * 4) - *(float *)(prim + uVar57 * 0x19 + 6)) * fVar201;
  fVar223 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(prim + uVar57 * 0x19 + 10)) * fVar201;
  fVar225 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(prim + uVar57 * 0x19 + 0xe)) * fVar201;
  fVar178 = *(float *)(ray + k * 4 + 0x40) * fVar201;
  fVar198 = *(float *)(ray + k * 4 + 0x50) * fVar201;
  fVar201 = *(float *)(ray + k * 4 + 0x60) * fVar201;
  uVar56 = *(undefined4 *)(prim + uVar57 * 4 + 6);
  uVar162 = (undefined1)((uint)uVar56 >> 0x18);
  uVar120 = CONCAT11(uVar162,uVar162);
  uVar162 = (undefined1)((uint)uVar56 >> 0x10);
  uVar76 = CONCAT35(CONCAT21(uVar120,uVar162),CONCAT14(uVar162,uVar56));
  uVar162 = (undefined1)((uint)uVar56 >> 8);
  uVar37 = CONCAT51(CONCAT41((int)((ulong)uVar76 >> 0x20),uVar162),uVar162);
  sVar123 = CONCAT11((char)uVar56,(char)uVar56);
  uVar66 = CONCAT62(uVar37,sVar123);
  auVar127._8_4_ = 0;
  auVar127._0_8_ = uVar66;
  auVar127._12_2_ = uVar120;
  auVar127._14_2_ = uVar120;
  uVar120 = (undefined2)((ulong)uVar76 >> 0x20);
  auVar126._12_4_ = auVar127._12_4_;
  auVar126._8_2_ = 0;
  auVar126._0_8_ = uVar66;
  auVar126._10_2_ = uVar120;
  auVar125._10_6_ = auVar126._10_6_;
  auVar125._8_2_ = uVar120;
  auVar125._0_8_ = uVar66;
  uVar120 = (undefined2)uVar37;
  auVar38._4_8_ = auVar125._8_8_;
  auVar38._2_2_ = uVar120;
  auVar38._0_2_ = uVar120;
  fVar165 = (float)((int)sVar123 >> 8);
  fVar171 = (float)(auVar38._0_4_ >> 0x18);
  fVar173 = (float)(auVar125._8_4_ >> 0x18);
  uVar56 = *(undefined4 *)(prim + uVar57 * 5 + 6);
  uVar162 = (undefined1)((uint)uVar56 >> 0x18);
  uVar120 = CONCAT11(uVar162,uVar162);
  uVar162 = (undefined1)((uint)uVar56 >> 0x10);
  uVar76 = CONCAT35(CONCAT21(uVar120,uVar162),CONCAT14(uVar162,uVar56));
  uVar162 = (undefined1)((uint)uVar56 >> 8);
  uVar37 = CONCAT51(CONCAT41((int)((ulong)uVar76 >> 0x20),uVar162),uVar162);
  sVar123 = CONCAT11((char)uVar56,(char)uVar56);
  uVar66 = CONCAT62(uVar37,sVar123);
  auVar130._8_4_ = 0;
  auVar130._0_8_ = uVar66;
  auVar130._12_2_ = uVar120;
  auVar130._14_2_ = uVar120;
  uVar120 = (undefined2)((ulong)uVar76 >> 0x20);
  auVar129._12_4_ = auVar130._12_4_;
  auVar129._8_2_ = 0;
  auVar129._0_8_ = uVar66;
  auVar129._10_2_ = uVar120;
  auVar128._10_6_ = auVar129._10_6_;
  auVar128._8_2_ = uVar120;
  auVar128._0_8_ = uVar66;
  uVar120 = (undefined2)uVar37;
  auVar39._4_8_ = auVar128._8_8_;
  auVar39._2_2_ = uVar120;
  auVar39._0_2_ = uVar120;
  fVar228 = (float)((int)sVar123 >> 8);
  fVar245 = (float)(auVar39._0_4_ >> 0x18);
  fVar247 = (float)(auVar128._8_4_ >> 0x18);
  uVar56 = *(undefined4 *)(prim + uVar57 * 6 + 6);
  uVar162 = (undefined1)((uint)uVar56 >> 0x18);
  uVar120 = CONCAT11(uVar162,uVar162);
  uVar162 = (undefined1)((uint)uVar56 >> 0x10);
  uVar76 = CONCAT35(CONCAT21(uVar120,uVar162),CONCAT14(uVar162,uVar56));
  uVar162 = (undefined1)((uint)uVar56 >> 8);
  uVar37 = CONCAT51(CONCAT41((int)((ulong)uVar76 >> 0x20),uVar162),uVar162);
  sVar123 = CONCAT11((char)uVar56,(char)uVar56);
  uVar66 = CONCAT62(uVar37,sVar123);
  auVar133._8_4_ = 0;
  auVar133._0_8_ = uVar66;
  auVar133._12_2_ = uVar120;
  auVar133._14_2_ = uVar120;
  uVar120 = (undefined2)((ulong)uVar76 >> 0x20);
  auVar132._12_4_ = auVar133._12_4_;
  auVar132._8_2_ = 0;
  auVar132._0_8_ = uVar66;
  auVar132._10_2_ = uVar120;
  auVar131._10_6_ = auVar132._10_6_;
  auVar131._8_2_ = uVar120;
  auVar131._0_8_ = uVar66;
  uVar120 = (undefined2)uVar37;
  auVar40._4_8_ = auVar131._8_8_;
  auVar40._2_2_ = uVar120;
  auVar40._0_2_ = uVar120;
  fVar277 = (float)((int)sVar123 >> 8);
  fVar288 = (float)(auVar40._0_4_ >> 0x18);
  fVar293 = (float)(auVar131._8_4_ >> 0x18);
  uVar56 = *(undefined4 *)(prim + uVar57 * 0xb + 6);
  uVar162 = (undefined1)((uint)uVar56 >> 0x18);
  uVar120 = CONCAT11(uVar162,uVar162);
  uVar162 = (undefined1)((uint)uVar56 >> 0x10);
  uVar76 = CONCAT35(CONCAT21(uVar120,uVar162),CONCAT14(uVar162,uVar56));
  uVar162 = (undefined1)((uint)uVar56 >> 8);
  uVar37 = CONCAT51(CONCAT41((int)((ulong)uVar76 >> 0x20),uVar162),uVar162);
  sVar123 = CONCAT11((char)uVar56,(char)uVar56);
  uVar66 = CONCAT62(uVar37,sVar123);
  auVar136._8_4_ = 0;
  auVar136._0_8_ = uVar66;
  auVar136._12_2_ = uVar120;
  auVar136._14_2_ = uVar120;
  uVar120 = (undefined2)((ulong)uVar76 >> 0x20);
  auVar135._12_4_ = auVar136._12_4_;
  auVar135._8_2_ = 0;
  auVar135._0_8_ = uVar66;
  auVar135._10_2_ = uVar120;
  auVar134._10_6_ = auVar135._10_6_;
  auVar134._8_2_ = uVar120;
  auVar134._0_8_ = uVar66;
  uVar120 = (undefined2)uVar37;
  auVar41._4_8_ = auVar134._8_8_;
  auVar41._2_2_ = uVar120;
  auVar41._0_2_ = uVar120;
  fVar75 = (float)((int)sVar123 >> 8);
  fVar121 = (float)(auVar41._0_4_ >> 0x18);
  fVar122 = (float)(auVar134._8_4_ >> 0x18);
  uVar56 = *(undefined4 *)(prim + uVar57 * 0xc + 6);
  uVar162 = (undefined1)((uint)uVar56 >> 0x18);
  uVar120 = CONCAT11(uVar162,uVar162);
  uVar162 = (undefined1)((uint)uVar56 >> 0x10);
  uVar76 = CONCAT35(CONCAT21(uVar120,uVar162),CONCAT14(uVar162,uVar56));
  uVar162 = (undefined1)((uint)uVar56 >> 8);
  uVar37 = CONCAT51(CONCAT41((int)((ulong)uVar76 >> 0x20),uVar162),uVar162);
  sVar123 = CONCAT11((char)uVar56,(char)uVar56);
  uVar66 = CONCAT62(uVar37,sVar123);
  auVar253._8_4_ = 0;
  auVar253._0_8_ = uVar66;
  auVar253._12_2_ = uVar120;
  auVar253._14_2_ = uVar120;
  uVar120 = (undefined2)((ulong)uVar76 >> 0x20);
  auVar252._12_4_ = auVar253._12_4_;
  auVar252._8_2_ = 0;
  auVar252._0_8_ = uVar66;
  auVar252._10_2_ = uVar120;
  auVar251._10_6_ = auVar252._10_6_;
  auVar251._8_2_ = uVar120;
  auVar251._0_8_ = uVar66;
  uVar120 = (undefined2)uVar37;
  auVar42._4_8_ = auVar251._8_8_;
  auVar42._2_2_ = uVar120;
  auVar42._0_2_ = uVar120;
  fVar274 = (float)((int)sVar123 >> 8);
  fVar275 = (float)(auVar42._0_4_ >> 0x18);
  fVar276 = (float)(auVar251._8_4_ >> 0x18);
  uVar56 = *(undefined4 *)(prim + uVar57 * 0xd + 6);
  uVar162 = (undefined1)((uint)uVar56 >> 0x18);
  uVar120 = CONCAT11(uVar162,uVar162);
  uVar162 = (undefined1)((uint)uVar56 >> 0x10);
  uVar76 = CONCAT35(CONCAT21(uVar120,uVar162),CONCAT14(uVar162,uVar56));
  uVar162 = (undefined1)((uint)uVar56 >> 8);
  uVar37 = CONCAT51(CONCAT41((int)((ulong)uVar76 >> 0x20),uVar162),uVar162);
  sVar123 = CONCAT11((char)uVar56,(char)uVar56);
  uVar66 = CONCAT62(uVar37,sVar123);
  auVar256._8_4_ = 0;
  auVar256._0_8_ = uVar66;
  auVar256._12_2_ = uVar120;
  auVar256._14_2_ = uVar120;
  uVar120 = (undefined2)((ulong)uVar76 >> 0x20);
  auVar255._12_4_ = auVar256._12_4_;
  auVar255._8_2_ = 0;
  auVar255._0_8_ = uVar66;
  auVar255._10_2_ = uVar120;
  auVar254._10_6_ = auVar255._10_6_;
  auVar254._8_2_ = uVar120;
  auVar254._0_8_ = uVar66;
  uVar120 = (undefined2)uVar37;
  auVar43._4_8_ = auVar254._8_8_;
  auVar43._2_2_ = uVar120;
  auVar43._0_2_ = uVar120;
  fVar317 = (float)((int)sVar123 >> 8);
  fVar319 = (float)(auVar43._0_4_ >> 0x18);
  fVar321 = (float)(auVar254._8_4_ >> 0x18);
  uVar56 = *(undefined4 *)(prim + uVar57 * 0x12 + 6);
  uVar162 = (undefined1)((uint)uVar56 >> 0x18);
  uVar120 = CONCAT11(uVar162,uVar162);
  uVar162 = (undefined1)((uint)uVar56 >> 0x10);
  uVar76 = CONCAT35(CONCAT21(uVar120,uVar162),CONCAT14(uVar162,uVar56));
  uVar162 = (undefined1)((uint)uVar56 >> 8);
  uVar37 = CONCAT51(CONCAT41((int)((ulong)uVar76 >> 0x20),uVar162),uVar162);
  sVar123 = CONCAT11((char)uVar56,(char)uVar56);
  uVar66 = CONCAT62(uVar37,sVar123);
  auVar259._8_4_ = 0;
  auVar259._0_8_ = uVar66;
  auVar259._12_2_ = uVar120;
  auVar259._14_2_ = uVar120;
  uVar120 = (undefined2)((ulong)uVar76 >> 0x20);
  auVar258._12_4_ = auVar259._12_4_;
  auVar258._8_2_ = 0;
  auVar258._0_8_ = uVar66;
  auVar258._10_2_ = uVar120;
  auVar257._10_6_ = auVar258._10_6_;
  auVar257._8_2_ = uVar120;
  auVar257._0_8_ = uVar66;
  uVar120 = (undefined2)uVar37;
  auVar44._4_8_ = auVar257._8_8_;
  auVar44._2_2_ = uVar120;
  auVar44._0_2_ = uVar120;
  fVar303 = (float)((int)sVar123 >> 8);
  fVar312 = (float)(auVar44._0_4_ >> 0x18);
  fVar314 = (float)(auVar257._8_4_ >> 0x18);
  uVar56 = *(undefined4 *)(prim + uVar57 * 0x13 + 6);
  uVar162 = (undefined1)((uint)uVar56 >> 0x18);
  uVar120 = CONCAT11(uVar162,uVar162);
  uVar162 = (undefined1)((uint)uVar56 >> 0x10);
  uVar76 = CONCAT35(CONCAT21(uVar120,uVar162),CONCAT14(uVar162,uVar56));
  uVar162 = (undefined1)((uint)uVar56 >> 8);
  uVar37 = CONCAT51(CONCAT41((int)((ulong)uVar76 >> 0x20),uVar162),uVar162);
  sVar123 = CONCAT11((char)uVar56,(char)uVar56);
  uVar66 = CONCAT62(uVar37,sVar123);
  auVar262._8_4_ = 0;
  auVar262._0_8_ = uVar66;
  auVar262._12_2_ = uVar120;
  auVar262._14_2_ = uVar120;
  uVar120 = (undefined2)((ulong)uVar76 >> 0x20);
  auVar261._12_4_ = auVar262._12_4_;
  auVar261._8_2_ = 0;
  auVar261._0_8_ = uVar66;
  auVar261._10_2_ = uVar120;
  auVar260._10_6_ = auVar261._10_6_;
  auVar260._8_2_ = uVar120;
  auVar260._0_8_ = uVar66;
  uVar120 = (undefined2)uVar37;
  auVar45._4_8_ = auVar260._8_8_;
  auVar45._2_2_ = uVar120;
  auVar45._0_2_ = uVar120;
  fVar324 = (float)((int)sVar123 >> 8);
  fVar328 = (float)(auVar45._0_4_ >> 0x18);
  fVar333 = (float)(auVar260._8_4_ >> 0x18);
  uVar56 = *(undefined4 *)(prim + uVar57 * 0x14 + 6);
  uVar162 = (undefined1)((uint)uVar56 >> 0x18);
  uVar120 = CONCAT11(uVar162,uVar162);
  uVar162 = (undefined1)((uint)uVar56 >> 0x10);
  uVar76 = CONCAT35(CONCAT21(uVar120,uVar162),CONCAT14(uVar162,uVar56));
  uVar162 = (undefined1)((uint)uVar56 >> 8);
  uVar37 = CONCAT51(CONCAT41((int)((ulong)uVar76 >> 0x20),uVar162),uVar162);
  sVar123 = CONCAT11((char)uVar56,(char)uVar56);
  uVar66 = CONCAT62(uVar37,sVar123);
  auVar347._8_4_ = 0;
  auVar347._0_8_ = uVar66;
  auVar347._12_2_ = uVar120;
  auVar347._14_2_ = uVar120;
  uVar120 = (undefined2)((ulong)uVar76 >> 0x20);
  auVar346._12_4_ = auVar347._12_4_;
  auVar346._8_2_ = 0;
  auVar346._0_8_ = uVar66;
  auVar346._10_2_ = uVar120;
  auVar345._10_6_ = auVar346._10_6_;
  auVar345._8_2_ = uVar120;
  auVar345._0_8_ = uVar66;
  uVar120 = (undefined2)uVar37;
  auVar46._4_8_ = auVar345._8_8_;
  auVar46._2_2_ = uVar120;
  auVar46._0_2_ = uVar120;
  fVar124 = (float)((int)sVar123 >> 8);
  fVar163 = (float)(auVar46._0_4_ >> 0x18);
  fVar164 = (float)(auVar345._8_4_ >> 0x18);
  fVar361 = fVar178 * fVar165 + fVar198 * fVar228 + fVar201 * fVar277;
  fVar365 = fVar178 * fVar171 + fVar198 * fVar245 + fVar201 * fVar288;
  fVar369 = fVar178 * fVar173 + fVar198 * fVar247 + fVar201 * fVar293;
  fVar373 = fVar178 * (float)(auVar126._12_4_ >> 0x18) +
            fVar198 * (float)(auVar129._12_4_ >> 0x18) + fVar201 * (float)(auVar132._12_4_ >> 0x18);
  fVar342 = fVar178 * fVar75 + fVar198 * fVar274 + fVar201 * fVar317;
  fVar352 = fVar178 * fVar121 + fVar198 * fVar275 + fVar201 * fVar319;
  fVar355 = fVar178 * fVar122 + fVar198 * fVar276 + fVar201 * fVar321;
  fVar358 = fVar178 * (float)(auVar135._12_4_ >> 0x18) +
            fVar198 * (float)(auVar252._12_4_ >> 0x18) + fVar201 * (float)(auVar255._12_4_ >> 0x18);
  fVar250 = fVar178 * fVar303 + fVar198 * fVar324 + fVar201 * fVar124;
  fVar272 = fVar178 * fVar312 + fVar198 * fVar328 + fVar201 * fVar163;
  fVar273 = fVar178 * fVar314 + fVar198 * fVar333 + fVar201 * fVar164;
  fVar178 = fVar178 * (float)(auVar258._12_4_ >> 0x18) +
            fVar198 * (float)(auVar261._12_4_ >> 0x18) + fVar201 * (float)(auVar346._12_4_ >> 0x18);
  fVar228 = fVar165 * fVar208 + fVar228 * fVar223 + fVar277 * fVar225;
  fVar245 = fVar171 * fVar208 + fVar245 * fVar223 + fVar288 * fVar225;
  fVar247 = fVar173 * fVar208 + fVar247 * fVar223 + fVar293 * fVar225;
  fVar277 = (float)(auVar126._12_4_ >> 0x18) * fVar208 +
            (float)(auVar129._12_4_ >> 0x18) * fVar223 + (float)(auVar132._12_4_ >> 0x18) * fVar225;
  fVar288 = fVar75 * fVar208 + fVar274 * fVar223 + fVar317 * fVar225;
  fVar293 = fVar121 * fVar208 + fVar275 * fVar223 + fVar319 * fVar225;
  fVar317 = fVar122 * fVar208 + fVar276 * fVar223 + fVar321 * fVar225;
  fVar319 = (float)(auVar135._12_4_ >> 0x18) * fVar208 +
            (float)(auVar252._12_4_ >> 0x18) * fVar223 + (float)(auVar255._12_4_ >> 0x18) * fVar225;
  fVar274 = fVar208 * fVar303 + fVar223 * fVar324 + fVar225 * fVar124;
  fVar275 = fVar208 * fVar312 + fVar223 * fVar328 + fVar225 * fVar163;
  fVar276 = fVar208 * fVar314 + fVar223 * fVar333 + fVar225 * fVar164;
  fVar208 = fVar208 * (float)(auVar258._12_4_ >> 0x18) +
            fVar223 * (float)(auVar261._12_4_ >> 0x18) + fVar225 * (float)(auVar346._12_4_ >> 0x18);
  fVar201 = (float)DAT_01f4bd50;
  fVar75 = DAT_01f4bd50._4_4_;
  fVar121 = DAT_01f4bd50._8_4_;
  fVar122 = DAT_01f4bd50._12_4_;
  uVar70 = -(uint)(fVar201 <= ABS(fVar361));
  uVar71 = -(uint)(fVar75 <= ABS(fVar365));
  uVar72 = -(uint)(fVar121 <= ABS(fVar369));
  uVar73 = -(uint)(fVar122 <= ABS(fVar373));
  auVar211._0_4_ = ~uVar70 & (uint)fVar201;
  auVar211._4_4_ = ~uVar71 & (uint)fVar75;
  auVar211._8_4_ = ~uVar72 & (uint)fVar121;
  auVar211._12_4_ = ~uVar73 & (uint)fVar122;
  auVar232._4_4_ = (uint)fVar365 & uVar71;
  auVar232._0_4_ = (uint)fVar361 & uVar70;
  auVar232._8_4_ = (uint)fVar369 & uVar72;
  auVar232._12_4_ = (uint)fVar373 & uVar73;
  auVar211 = auVar211 | auVar232;
  uVar70 = -(uint)(fVar201 <= ABS(fVar342));
  uVar71 = -(uint)(fVar75 <= ABS(fVar352));
  uVar72 = -(uint)(fVar121 <= ABS(fVar355));
  uVar73 = -(uint)(fVar122 <= ABS(fVar358));
  auVar348._0_4_ = (uint)fVar342 & uVar70;
  auVar348._4_4_ = (uint)fVar352 & uVar71;
  auVar348._8_4_ = (uint)fVar355 & uVar72;
  auVar348._12_4_ = (uint)fVar358 & uVar73;
  auVar230._0_4_ = ~uVar70 & (uint)fVar201;
  auVar230._4_4_ = ~uVar71 & (uint)fVar75;
  auVar230._8_4_ = ~uVar72 & (uint)fVar121;
  auVar230._12_4_ = ~uVar73 & (uint)fVar122;
  auVar230 = auVar230 | auVar348;
  uVar70 = -(uint)(fVar201 <= ABS(fVar250));
  uVar71 = -(uint)(fVar75 <= ABS(fVar272));
  uVar72 = -(uint)(fVar121 <= ABS(fVar273));
  uVar73 = -(uint)(fVar122 <= ABS(fVar178));
  auVar263._0_4_ = (uint)fVar250 & uVar70;
  auVar263._4_4_ = (uint)fVar272 & uVar71;
  auVar263._8_4_ = (uint)fVar273 & uVar72;
  auVar263._12_4_ = (uint)fVar178 & uVar73;
  auVar305._0_4_ = ~uVar70 & (uint)fVar201;
  auVar305._4_4_ = ~uVar71 & (uint)fVar75;
  auVar305._8_4_ = ~uVar72 & (uint)fVar121;
  auVar305._12_4_ = ~uVar73 & (uint)fVar122;
  auVar305 = auVar305 | auVar263;
  auVar77 = rcpps(_DAT_01f4bd50,auVar211);
  fVar201 = auVar77._0_4_;
  fVar122 = auVar77._4_4_;
  fVar164 = auVar77._8_4_;
  fVar173 = auVar77._12_4_;
  fVar201 = (1.0 - auVar211._0_4_ * fVar201) * fVar201 + fVar201;
  fVar122 = (1.0 - auVar211._4_4_ * fVar122) * fVar122 + fVar122;
  fVar164 = (1.0 - auVar211._8_4_ * fVar164) * fVar164 + fVar164;
  fVar173 = (1.0 - auVar211._12_4_ * fVar173) * fVar173 + fVar173;
  auVar77 = rcpps(auVar77,auVar230);
  fVar75 = auVar77._0_4_;
  fVar124 = auVar77._4_4_;
  fVar165 = auVar77._8_4_;
  fVar178 = auVar77._12_4_;
  fVar75 = (1.0 - auVar230._0_4_ * fVar75) * fVar75 + fVar75;
  fVar124 = (1.0 - auVar230._4_4_ * fVar124) * fVar124 + fVar124;
  fVar165 = (1.0 - auVar230._8_4_ * fVar165) * fVar165 + fVar165;
  fVar178 = (1.0 - auVar230._12_4_ * fVar178) * fVar178 + fVar178;
  auVar77 = rcpps(auVar77,auVar305);
  fVar121 = auVar77._0_4_;
  fVar163 = auVar77._4_4_;
  fVar171 = auVar77._8_4_;
  fVar198 = auVar77._12_4_;
  fVar121 = (1.0 - auVar305._0_4_ * fVar121) * fVar121 + fVar121;
  fVar163 = (1.0 - auVar305._4_4_ * fVar163) * fVar163 + fVar163;
  fVar171 = (1.0 - auVar305._8_4_ * fVar171) * fVar171 + fVar171;
  fVar198 = (1.0 - auVar305._12_4_ * fVar198) * fVar198 + fVar198;
  uVar66 = *(ulong *)(prim + uVar57 * 7 + 6);
  uVar120 = (undefined2)(uVar66 >> 0x30);
  auVar233._8_4_ = 0;
  auVar233._0_8_ = uVar66;
  auVar233._12_2_ = uVar120;
  auVar233._14_2_ = uVar120;
  uVar120 = (undefined2)(uVar66 >> 0x20);
  auVar307._12_4_ = auVar233._12_4_;
  auVar307._8_2_ = 0;
  auVar307._0_8_ = uVar66;
  auVar307._10_2_ = uVar120;
  auVar78._10_6_ = auVar307._10_6_;
  auVar78._8_2_ = uVar120;
  auVar78._0_8_ = uVar66;
  uVar120 = (undefined2)(uVar66 >> 0x10);
  auVar47._4_8_ = auVar78._8_8_;
  auVar47._2_2_ = uVar120;
  auVar47._0_2_ = uVar120;
  auVar212._0_8_ =
       CONCAT44(((float)(auVar47._0_4_ >> 0x10) - fVar245) * fVar122,
                ((float)(int)(short)uVar66 - fVar228) * fVar201);
  auVar212._8_4_ = ((float)(auVar78._8_4_ >> 0x10) - fVar247) * fVar164;
  auVar212._12_4_ = ((float)(auVar307._12_4_ >> 0x10) - fVar277) * fVar173;
  uVar66 = *(ulong *)(prim + uVar57 * 9 + 6);
  uVar120 = (undefined2)(uVar66 >> 0x30);
  auVar81._8_4_ = 0;
  auVar81._0_8_ = uVar66;
  auVar81._12_2_ = uVar120;
  auVar81._14_2_ = uVar120;
  uVar120 = (undefined2)(uVar66 >> 0x20);
  auVar80._12_4_ = auVar81._12_4_;
  auVar80._8_2_ = 0;
  auVar80._0_8_ = uVar66;
  auVar80._10_2_ = uVar120;
  auVar79._10_6_ = auVar80._10_6_;
  auVar79._8_2_ = uVar120;
  auVar79._0_8_ = uVar66;
  uVar120 = (undefined2)(uVar66 >> 0x10);
  auVar48._4_8_ = auVar79._8_8_;
  auVar48._2_2_ = uVar120;
  auVar48._0_2_ = uVar120;
  auVar264._0_4_ = ((float)(int)(short)uVar66 - fVar228) * fVar201;
  auVar264._4_4_ = ((float)(auVar48._0_4_ >> 0x10) - fVar245) * fVar122;
  auVar264._8_4_ = ((float)(auVar79._8_4_ >> 0x10) - fVar247) * fVar164;
  auVar264._12_4_ = ((float)(auVar80._12_4_ >> 0x10) - fVar277) * fVar173;
  uVar66 = *(ulong *)(prim + uVar57 * 0xe + 6);
  uVar120 = (undefined2)(uVar66 >> 0x30);
  auVar84._8_4_ = 0;
  auVar84._0_8_ = uVar66;
  auVar84._12_2_ = uVar120;
  auVar84._14_2_ = uVar120;
  uVar120 = (undefined2)(uVar66 >> 0x20);
  auVar83._12_4_ = auVar84._12_4_;
  auVar83._8_2_ = 0;
  auVar83._0_8_ = uVar66;
  auVar83._10_2_ = uVar120;
  auVar82._10_6_ = auVar83._10_6_;
  auVar82._8_2_ = uVar120;
  auVar82._0_8_ = uVar66;
  uVar120 = (undefined2)(uVar66 >> 0x10);
  auVar49._4_8_ = auVar82._8_8_;
  auVar49._2_2_ = uVar120;
  auVar49._0_2_ = uVar120;
  auVar166._0_8_ =
       CONCAT44(((float)(auVar49._0_4_ >> 0x10) - fVar293) * fVar124,
                ((float)(int)(short)uVar66 - fVar288) * fVar75);
  auVar166._8_4_ = ((float)(auVar82._8_4_ >> 0x10) - fVar317) * fVar165;
  auVar166._12_4_ = ((float)(auVar83._12_4_ >> 0x10) - fVar319) * fVar178;
  uVar70 = (uint)(byte)PVar8;
  uVar66 = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  uVar120 = (undefined2)(uVar66 >> 0x30);
  auVar87._8_4_ = 0;
  auVar87._0_8_ = uVar66;
  auVar87._12_2_ = uVar120;
  auVar87._14_2_ = uVar120;
  uVar120 = (undefined2)(uVar66 >> 0x20);
  auVar86._12_4_ = auVar87._12_4_;
  auVar86._8_2_ = 0;
  auVar86._0_8_ = uVar66;
  auVar86._10_2_ = uVar120;
  auVar85._10_6_ = auVar86._10_6_;
  auVar85._8_2_ = uVar120;
  auVar85._0_8_ = uVar66;
  uVar120 = (undefined2)(uVar66 >> 0x10);
  auVar50._4_8_ = auVar85._8_8_;
  auVar50._2_2_ = uVar120;
  auVar50._0_2_ = uVar120;
  auVar281._0_4_ = ((float)(int)(short)uVar66 - fVar288) * fVar75;
  auVar281._4_4_ = ((float)(auVar50._0_4_ >> 0x10) - fVar293) * fVar124;
  auVar281._8_4_ = ((float)(auVar85._8_4_ >> 0x10) - fVar317) * fVar165;
  auVar281._12_4_ = ((float)(auVar86._12_4_ >> 0x10) - fVar319) * fVar178;
  uVar66 = *(ulong *)(prim + uVar57 * 0x15 + 6);
  uVar120 = (undefined2)(uVar66 >> 0x30);
  auVar90._8_4_ = 0;
  auVar90._0_8_ = uVar66;
  auVar90._12_2_ = uVar120;
  auVar90._14_2_ = uVar120;
  uVar120 = (undefined2)(uVar66 >> 0x20);
  auVar89._12_4_ = auVar90._12_4_;
  auVar89._8_2_ = 0;
  auVar89._0_8_ = uVar66;
  auVar89._10_2_ = uVar120;
  auVar88._10_6_ = auVar89._10_6_;
  auVar88._8_2_ = uVar120;
  auVar88._0_8_ = uVar66;
  uVar120 = (undefined2)(uVar66 >> 0x10);
  auVar51._4_8_ = auVar88._8_8_;
  auVar51._2_2_ = uVar120;
  auVar51._0_2_ = uVar120;
  auVar137._0_8_ =
       CONCAT44(((float)(auVar51._0_4_ >> 0x10) - fVar275) * fVar163,
                ((float)(int)(short)uVar66 - fVar274) * fVar121);
  auVar137._8_4_ = ((float)(auVar88._8_4_ >> 0x10) - fVar276) * fVar171;
  auVar137._12_4_ = ((float)(auVar89._12_4_ >> 0x10) - fVar208) * fVar198;
  uVar66 = *(ulong *)(prim + uVar57 * 0x17 + 6);
  uVar120 = (undefined2)(uVar66 >> 0x30);
  auVar93._8_4_ = 0;
  auVar93._0_8_ = uVar66;
  auVar93._12_2_ = uVar120;
  auVar93._14_2_ = uVar120;
  uVar120 = (undefined2)(uVar66 >> 0x20);
  auVar92._12_4_ = auVar93._12_4_;
  auVar92._8_2_ = 0;
  auVar92._0_8_ = uVar66;
  auVar92._10_2_ = uVar120;
  auVar91._10_6_ = auVar92._10_6_;
  auVar91._8_2_ = uVar120;
  auVar91._0_8_ = uVar66;
  uVar120 = (undefined2)(uVar66 >> 0x10);
  auVar52._4_8_ = auVar91._8_8_;
  auVar52._2_2_ = uVar120;
  auVar52._0_2_ = uVar120;
  auVar94._0_4_ = ((float)(int)(short)uVar66 - fVar274) * fVar121;
  auVar94._4_4_ = ((float)(auVar52._0_4_ >> 0x10) - fVar275) * fVar163;
  auVar94._8_4_ = ((float)(auVar91._8_4_ >> 0x10) - fVar276) * fVar171;
  auVar94._12_4_ = ((float)(auVar92._12_4_ >> 0x10) - fVar208) * fVar198;
  auVar231._8_4_ = auVar212._8_4_;
  auVar231._0_8_ = auVar212._0_8_;
  auVar231._12_4_ = auVar212._12_4_;
  auVar232 = minps(auVar231,auVar264);
  auVar181._8_4_ = auVar166._8_4_;
  auVar181._0_8_ = auVar166._0_8_;
  auVar181._12_4_ = auVar166._12_4_;
  auVar77 = minps(auVar181,auVar281);
  auVar233 = maxps(auVar232,auVar77);
  auVar182._8_4_ = auVar137._8_4_;
  auVar182._0_8_ = auVar137._0_8_;
  auVar182._12_4_ = auVar137._12_4_;
  auVar232 = minps(auVar182,auVar94);
  auVar77._4_4_ = uVar5;
  auVar77._0_4_ = uVar5;
  auVar77._8_4_ = uVar5;
  auVar77._12_4_ = uVar5;
  auVar77 = maxps(auVar232,auVar77);
  auVar77 = maxps(auVar233,auVar77);
  fVar201 = auVar77._0_4_ * 0.99999964;
  fVar75 = auVar77._4_4_ * 0.99999964;
  fVar121 = auVar77._8_4_ * 0.99999964;
  fVar122 = auVar77._12_4_ * 0.99999964;
  auVar232 = maxps(auVar212,auVar264);
  auVar77 = maxps(auVar166,auVar281);
  auVar232 = minps(auVar232,auVar77);
  auVar77 = maxps(auVar137,auVar94);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar95._4_4_ = uVar5;
  auVar95._0_4_ = uVar5;
  auVar95._8_4_ = uVar5;
  auVar95._12_4_ = uVar5;
  auVar77 = minps(auVar77,auVar95);
  auVar77 = minps(auVar232,auVar77);
  auVar138._0_4_ = -(uint)(uVar70 != 0 && fVar201 <= auVar77._0_4_ * 1.0000004);
  auVar138._4_4_ = -(uint)(1 < uVar70 && fVar75 <= auVar77._4_4_ * 1.0000004);
  auVar138._8_4_ = -(uint)(2 < uVar70 && fVar121 <= auVar77._8_4_ * 1.0000004);
  auVar138._12_4_ = -(uint)(3 < uVar70 && fVar122 <= auVar77._12_4_ * 1.0000004);
  uVar70 = movmskps(uVar70 << 4,auVar138);
  auVar139._0_12_ = mm_lookupmask_ps._240_12_;
  auVar139._12_4_ = 0;
LAB_002c0eb4:
  uVar66 = (ulong)uVar70;
  if (uVar66 == 0) {
LAB_002c380a:
    return uVar66 != 0;
  }
  lVar62 = 0;
  if (uVar66 != 0) {
    for (; (uVar70 >> lVar62 & 1) == 0; lVar62 = lVar62 + 1) {
    }
  }
  uVar67 = uVar66 - 1 & uVar66;
  uVar5 = *(undefined4 *)(prim + lVar62 * 4 + 6);
  lVar62 = lVar62 * 0x40;
  lVar11 = 0;
  if (uVar67 != 0) {
    for (; (uVar67 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
    }
  }
  uVar70 = *(uint *)(prim + 2);
  local_5e0 = (ulong)uVar70;
  pPVar1 = prim + lVar62 + uVar57 * 0x19 + 0x16;
  uVar64 = uVar67 - 1;
  if ((uVar67 != 0) && (uVar64 = uVar64 & uVar67, uVar64 != 0)) {
    lVar11 = 0;
    if (uVar64 != 0) {
      for (; (uVar64 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
      }
    }
    uVar64 = lVar11 << 6;
  }
  pPVar2 = prim + lVar62 + uVar57 * 0x19 + 0x26;
  pPVar3 = prim + lVar62 + uVar57 * 0x19 + 0x36;
  pPVar4 = prim + lVar62 + uVar57 * 0x19 + 0x46;
  fVar124 = *(float *)(ray + k * 4 + 0x40);
  local_6c8._4_4_ = *(undefined4 *)(ray + k * 4 + 0x50);
  fVar165 = *(float *)(ray + k * 4 + 0x60);
  dir.field_0.m128[1] = (float)local_6c8._4_4_;
  dir.field_0.m128[0] = fVar124;
  dir.field_0.m128[2] = fVar165;
  dir.field_0.m128[3] = 0.0;
  fVar163 = (float)local_6c8._4_4_ * (float)local_6c8._4_4_;
  fVar164 = fVar165 * fVar165;
  fVar178 = fVar163 + fVar124 * fVar124 + fVar164;
  auVar96._0_8_ = CONCAT44(fVar163 + fVar163 + 0.0,fVar178);
  auVar96._8_4_ = fVar163 + fVar164 + fVar164;
  auVar96._12_4_ = fVar163 + 0.0 + 0.0;
  auVar234._8_4_ = auVar96._8_4_;
  auVar234._0_8_ = auVar96._0_8_;
  auVar234._12_4_ = auVar96._12_4_;
  auVar77 = rcpss(auVar234,auVar96);
  fVar208 = (2.0 - auVar77._0_4_ * fVar178) * auVar77._0_4_ *
            (((*(float *)(pPVar1 + 8) + *(float *)(pPVar2 + 8) + *(float *)(pPVar3 + 8) +
              *(float *)(pPVar4 + 8)) * 0.25 - *(float *)(ray + k * 4 + 0x20)) * fVar165 +
            ((*(float *)(pPVar1 + 4) + *(float *)(pPVar2 + 4) + *(float *)(pPVar3 + 4) +
             *(float *)(pPVar4 + 4)) * 0.25 - *(float *)(ray + k * 4 + 0x10)) *
            (float)local_6c8._4_4_ +
            ((*(float *)pPVar1 + *(float *)pPVar2 + *(float *)pPVar3 + *(float *)pPVar4) * 0.25 -
            *(float *)(ray + k * 4)) * fVar124);
  fVar274 = fVar124 * fVar208 + *(float *)(ray + k * 4);
  fVar275 = (float)local_6c8._4_4_ * fVar208 + *(float *)(ray + k * 4 + 0x10);
  fVar276 = fVar165 * fVar208 + *(float *)(ray + k * 4 + 0x20);
  fVar223 = *(float *)pPVar1 - fVar274;
  fVar225 = *(float *)(pPVar1 + 4) - fVar275;
  fVar250 = *(float *)(pPVar1 + 8) - fVar276;
  fVar272 = *(float *)(pPVar1 + 0xc) - 0.0;
  fVar312 = *(float *)pPVar3 - fVar274;
  fVar314 = *(float *)(pPVar3 + 4) - fVar275;
  fVar317 = *(float *)(pPVar3 + 8) - fVar276;
  fVar319 = *(float *)(pPVar3 + 0xc) - 0.0;
  fVar273 = *(float *)pPVar2 - fVar274;
  fVar288 = *(float *)(pPVar2 + 4) - fVar275;
  fVar293 = *(float *)(pPVar2 + 8) - fVar276;
  fVar303 = *(float *)(pPVar2 + 0xc) - 0.0;
  fVar274 = *(float *)pPVar4 - fVar274;
  fVar275 = *(float *)(pPVar4 + 4) - fVar275;
  fVar276 = *(float *)(pPVar4 + 8) - fVar276;
  fVar333 = *(float *)(pPVar4 + 0xc) - 0.0;
  fVar163 = (float)local_6c8._4_4_ * (float)local_6c8._4_4_;
  fVar124 = fVar124 * fVar124;
  fVar321 = fVar124 + fVar163 + fVar164;
  fVar324 = fVar124 + fVar163 + fVar164;
  fVar328 = fVar124 + fVar163 + fVar164;
  fVar124 = fVar124 + fVar163 + fVar164;
  fVar163 = *(float *)(ray + k * 4 + 0x40);
  fVar198 = ABS(fVar321);
  fVar245 = ABS(fVar324);
  fVar247 = ABS(fVar328);
  fVar277 = ABS(fVar124);
  fVar164 = *(float *)(ray + k * 4 + 0x30);
  fVar228 = fVar164 - fVar208;
  bVar65 = 0;
  pSVar58 = (StackEntry *)0x1;
  local_6dc = 1;
  fVar171 = 0.0;
  fVar173 = 1.0;
  local_6c8._0_4_ = local_6c8._4_4_;
  fStack_6c0 = (float)local_6c8._4_4_;
  fStack_6bc = (float)local_6c8._4_4_;
  uVar63 = 0;
  local_5c8 = fVar208;
  fStack_5c4 = fVar208;
  fStack_5c0 = fVar208;
  fStack_5bc = fVar208;
  local_598 = fVar223;
  fStack_594 = fVar225;
  fStack_590 = fVar250;
  fStack_58c = fVar272;
  do {
    fVar209 = fVar173 - fVar171;
    fVar361 = fVar209 * 0.11111111;
    local_5d8._4_4_ = fVar171;
    local_5d8._0_4_ = fVar171;
    fStack_5d0 = fVar171;
    fStack_5cc = fVar171;
    fVar210 = fVar209 * 0.0 + fVar171;
    fVar224 = fVar209 * 0.33333334 + fVar171;
    fVar226 = fVar209 * 0.6666667 + fVar171;
    fVar227 = fVar209 * 1.0 + fVar171;
    fVar229 = 1.0 - fVar210;
    fVar246 = 1.0 - fVar224;
    fVar248 = 1.0 - fVar226;
    fVar249 = 1.0 - fVar227;
    fVar342 = fVar210 * fVar229;
    fVar352 = fVar224 * fVar246;
    fVar355 = fVar226 * fVar248;
    fVar358 = fVar227 * fVar249;
    fVar365 = fVar229 * fVar229 * fVar229;
    fVar373 = fVar246 * fVar246 * fVar246;
    fVar174 = fVar248 * fVar248 * fVar248;
    fVar176 = fVar249 * fVar249 * fVar249;
    fVar304 = fVar210 * fVar210 * fVar210;
    fVar313 = fVar224 * fVar224 * fVar224;
    fVar315 = fVar226 * fVar226 * fVar226;
    fVar316 = fVar227 * fVar227 * fVar227;
    fVar369 = fVar365 * 0.16666667;
    fVar172 = fVar373 * 0.16666667;
    fVar175 = fVar174 * 0.16666667;
    fVar177 = fVar176 * 0.16666667;
    fVar278 = (fVar210 * fVar342 * 6.0 + fVar229 * fVar342 * 12.0 + fVar365 * 4.0 + fVar304) *
              0.16666667;
    fVar289 = (fVar224 * fVar352 * 6.0 + fVar246 * fVar352 * 12.0 + fVar373 * 4.0 + fVar313) *
              0.16666667;
    fVar294 = (fVar226 * fVar355 * 6.0 + fVar248 * fVar355 * 12.0 + fVar174 * 4.0 + fVar315) *
              0.16666667;
    fVar298 = (fVar227 * fVar358 * 6.0 + fVar249 * fVar358 * 12.0 + fVar176 * 4.0 + fVar316) *
              0.16666667;
    fVar365 = (fVar229 * fVar342 * 6.0 + fVar210 * fVar342 * 12.0 + fVar304 * 4.0 + fVar365) *
              0.16666667;
    fVar373 = (fVar246 * fVar352 * 6.0 + fVar224 * fVar352 * 12.0 + fVar313 * 4.0 + fVar373) *
              0.16666667;
    fVar202 = (fVar248 * fVar355 * 6.0 + fVar226 * fVar355 * 12.0 + fVar315 * 4.0 + fVar174) *
              0.16666667;
    fVar205 = (fVar249 * fVar358 * 6.0 + fVar227 * fVar358 * 12.0 + fVar316 * 4.0 + fVar176) *
              0.16666667;
    fVar304 = fVar304 * 0.16666667;
    fVar313 = fVar313 * 0.16666667;
    fVar315 = fVar315 * 0.16666667;
    fVar316 = fVar316 * 0.16666667;
    fVar362 = fVar223 * fVar369 + fVar273 * fVar278 + fVar312 * fVar365 + fVar274 * fVar304;
    fVar366 = fVar223 * fVar172 + fVar273 * fVar289 + fVar312 * fVar373 + fVar274 * fVar313;
    fVar370 = fVar223 * fVar175 + fVar273 * fVar294 + fVar312 * fVar202 + fVar274 * fVar315;
    fVar374 = fVar223 * fVar177 + fVar273 * fVar298 + fVar312 * fVar205 + fVar274 * fVar316;
    fVar179 = fVar225 * fVar369 + fVar288 * fVar278 + fVar314 * fVar365 + fVar275 * fVar304;
    fVar199 = fVar225 * fVar172 + fVar288 * fVar289 + fVar314 * fVar373 + fVar275 * fVar313;
    fVar203 = fVar225 * fVar175 + fVar288 * fVar294 + fVar314 * fVar202 + fVar275 * fVar315;
    fVar206 = fVar225 * fVar177 + fVar288 * fVar298 + fVar314 * fVar205 + fVar275 * fVar316;
    fVar180 = fVar250 * fVar369 + fVar293 * fVar278 + fVar317 * fVar365 + fVar276 * fVar304;
    fVar200 = fVar250 * fVar172 + fVar293 * fVar289 + fVar317 * fVar373 + fVar276 * fVar313;
    fVar204 = fVar250 * fVar175 + fVar293 * fVar294 + fVar317 * fVar202 + fVar276 * fVar315;
    fVar207 = fVar250 * fVar177 + fVar293 * fVar298 + fVar317 * fVar205 + fVar276 * fVar316;
    fVar174 = fVar369 * fVar272 + fVar278 * fVar303 + fVar365 * fVar319 + fVar304 * fVar333;
    fVar176 = fVar172 * fVar272 + fVar289 * fVar303 + fVar373 * fVar319 + fVar313 * fVar333;
    auVar167._0_8_ = CONCAT44(fVar176,fVar174);
    auVar167._8_4_ = fVar175 * fVar272 + fVar294 * fVar303 + fVar202 * fVar319 + fVar315 * fVar333;
    auVar167._12_4_ = fVar177 * fVar272 + fVar298 * fVar303 + fVar205 * fVar319 + fVar316 * fVar333;
    fVar365 = -fVar229 * fVar229 * 0.5;
    fVar369 = -fVar246 * fVar246 * 0.5;
    fVar373 = -fVar248 * fVar248 * 0.5;
    fVar172 = -fVar249 * fVar249 * 0.5;
    fVar278 = (-fVar210 * fVar210 - fVar342 * 4.0) * 0.5;
    fVar289 = (-fVar224 * fVar224 - fVar352 * 4.0) * 0.5;
    fVar294 = (-fVar226 * fVar226 - fVar355 * 4.0) * 0.5;
    fVar298 = (-fVar227 * fVar227 - fVar358 * 4.0) * 0.5;
    fVar342 = (fVar342 * 4.0 + fVar229 * fVar229) * 0.5;
    fVar352 = (fVar352 * 4.0 + fVar246 * fVar246) * 0.5;
    fVar355 = (fVar355 * 4.0 + fVar248 * fVar248) * 0.5;
    fVar358 = (fVar358 * 4.0 + fVar249 * fVar249) * 0.5;
    fVar175 = fVar210 * fVar210 * 0.5;
    fVar177 = fVar224 * fVar224 * 0.5;
    fVar202 = fVar226 * fVar226 * 0.5;
    fVar205 = fVar227 * fVar227 * 0.5;
    fVar318 = (fVar223 * fVar365 + fVar273 * fVar278 + fVar312 * fVar342 + fVar274 * fVar175) *
              fVar361;
    fVar320 = (fVar223 * fVar369 + fVar273 * fVar289 + fVar312 * fVar352 + fVar274 * fVar177) *
              fVar361;
    fVar322 = (fVar223 * fVar373 + fVar273 * fVar294 + fVar312 * fVar355 + fVar274 * fVar202) *
              fVar361;
    fVar323 = (fVar223 * fVar172 + fVar273 * fVar298 + fVar312 * fVar358 + fVar274 * fVar205) *
              fVar361;
    fVar325 = (fVar225 * fVar365 + fVar288 * fVar278 + fVar314 * fVar342 + fVar275 * fVar175) *
              fVar361;
    fVar329 = (fVar225 * fVar369 + fVar288 * fVar289 + fVar314 * fVar352 + fVar275 * fVar177) *
              fVar361;
    auVar97._4_4_ = fVar329;
    auVar97._0_4_ = fVar325;
    fVar334 = (fVar225 * fVar373 + fVar288 * fVar294 + fVar314 * fVar355 + fVar275 * fVar202) *
              fVar361;
    fVar338 = (fVar225 * fVar172 + fVar288 * fVar298 + fVar314 * fVar358 + fVar275 * fVar205) *
              fVar361;
    fVar343 = (fVar250 * fVar365 + fVar293 * fVar278 + fVar317 * fVar342 + fVar276 * fVar175) *
              fVar361;
    fVar353 = (fVar250 * fVar369 + fVar293 * fVar289 + fVar317 * fVar352 + fVar276 * fVar177) *
              fVar361;
    fVar356 = (fVar250 * fVar373 + fVar293 * fVar294 + fVar317 * fVar355 + fVar276 * fVar202) *
              fVar361;
    fVar359 = (fVar250 * fVar172 + fVar293 * fVar298 + fVar317 * fVar358 + fVar276 * fVar205) *
              fVar361;
    fVar304 = fVar361 * (fVar369 * fVar272 +
                        fVar289 * fVar303 + fVar352 * fVar319 + fVar177 * fVar333);
    fVar313 = fVar361 * (fVar373 * fVar272 +
                        fVar294 * fVar303 + fVar355 * fVar319 + fVar202 * fVar333);
    fVar315 = fVar361 * (fVar172 * fVar272 +
                        fVar298 * fVar303 + fVar358 * fVar319 + fVar205 * fVar333);
    auVar265._0_8_ = CONCAT44(auVar167._8_4_ - fVar313,fVar176 - fVar304);
    auVar265._8_4_ = auVar167._12_4_ - fVar315;
    auVar265._12_4_ = 0;
    fVar224 = fVar199 - fVar179;
    fVar227 = fVar203 - fVar199;
    fVar246 = fVar206 - fVar203;
    fVar289 = 0.0 - fVar206;
    fVar363 = fVar200 - fVar180;
    fVar367 = fVar204 - fVar200;
    fVar371 = fVar207 - fVar204;
    fVar375 = 0.0 - fVar207;
    fVar248 = fVar325 * fVar363 - fVar343 * fVar224;
    fVar294 = fVar329 * fVar367 - fVar353 * fVar227;
    fVar249 = fVar334 * fVar371 - fVar356 * fVar246;
    fVar298 = fVar338 * fVar375 - fVar359 * fVar289;
    fVar377 = fVar366 - fVar362;
    fVar379 = fVar370 - fVar366;
    fVar381 = fVar374 - fVar370;
    fVar383 = 0.0 - fVar374;
    fVar373 = fVar343 * fVar377 - fVar318 * fVar363;
    fVar177 = fVar353 * fVar379 - fVar320 * fVar367;
    fVar205 = fVar356 * fVar381 - fVar322 * fVar371;
    fVar226 = fVar359 * fVar383 - fVar323 * fVar375;
    fVar316 = fVar318 * fVar224 - fVar325 * fVar377;
    fVar290 = fVar320 * fVar227 - fVar329 * fVar379;
    fVar295 = fVar322 * fVar246 - fVar334 * fVar381;
    fVar299 = fVar323 * fVar289 - fVar338 * fVar383;
    auVar140._0_4_ = fVar363 * fVar363;
    auVar140._4_4_ = fVar367 * fVar367;
    auVar140._8_4_ = fVar371 * fVar371;
    auVar140._12_4_ = fVar375 * fVar375;
    auVar282._0_4_ = fVar377 * fVar377 + fVar224 * fVar224 + auVar140._0_4_;
    auVar282._4_4_ = fVar379 * fVar379 + fVar227 * fVar227 + auVar140._4_4_;
    auVar282._8_4_ = fVar381 * fVar381 + fVar246 * fVar246 + auVar140._8_4_;
    auVar282._12_4_ = fVar383 * fVar383 + fVar289 * fVar289 + auVar140._12_4_;
    auVar77 = rcpps(auVar140,auVar282);
    fVar352 = auVar77._0_4_;
    fVar355 = auVar77._4_4_;
    fVar358 = auVar77._8_4_;
    fVar369 = auVar77._12_4_;
    fVar352 = (1.0 - fVar352 * auVar282._0_4_) * fVar352 + fVar352;
    fVar355 = (1.0 - fVar355 * auVar282._4_4_) * fVar355 + fVar355;
    fVar358 = (1.0 - fVar358 * auVar282._8_4_) * fVar358 + fVar358;
    fVar369 = (1.0 - fVar369 * auVar282._12_4_) * fVar369 + fVar369;
    auVar97._8_4_ = fVar334;
    auVar97._12_4_ = fVar338;
    fVar172 = fVar363 * fVar329 - fVar224 * fVar353;
    fVar202 = fVar367 * fVar334 - fVar227 * fVar356;
    fVar210 = fVar371 * fVar338 - fVar246 * fVar359;
    fVar229 = fVar375 * 0.0 - fVar289 * 0.0;
    fVar326 = fVar377 * fVar353 - fVar363 * fVar320;
    fVar330 = fVar379 * fVar356 - fVar367 * fVar322;
    fVar335 = fVar381 * fVar359 - fVar371 * fVar323;
    fVar339 = fVar383 * 0.0 - fVar375 * 0.0;
    fVar344 = fVar224 * fVar320 - fVar377 * fVar329;
    fVar354 = fVar227 * fVar322 - fVar379 * fVar334;
    fVar357 = fVar246 * fVar323 - fVar381 * fVar338;
    fVar360 = fVar289 * 0.0 - fVar383 * 0.0;
    auVar235._0_4_ = (fVar248 * fVar248 + fVar373 * fVar373 + fVar316 * fVar316) * fVar352;
    auVar235._4_4_ = (fVar294 * fVar294 + fVar177 * fVar177 + fVar290 * fVar290) * fVar355;
    auVar235._8_4_ = (fVar249 * fVar249 + fVar205 * fVar205 + fVar295 * fVar295) * fVar358;
    auVar235._12_4_ = (fVar298 * fVar298 + fVar226 * fVar226 + fVar299 * fVar299) * fVar369;
    auVar213._0_4_ = (fVar172 * fVar172 + fVar326 * fVar326 + fVar344 * fVar344) * fVar352;
    auVar213._4_4_ = (fVar202 * fVar202 + fVar330 * fVar330 + fVar354 * fVar354) * fVar355;
    auVar213._8_4_ = (fVar210 * fVar210 + fVar335 * fVar335 + fVar357 * fVar357) * fVar358;
    auVar213._12_4_ = (fVar229 * fVar229 + fVar339 * fVar339 + fVar360 * fVar360) * fVar369;
    auVar232 = maxps(auVar235,auVar213);
    fVar174 = fVar361 * (fVar365 * fVar272 +
                        fVar278 * fVar303 + fVar342 * fVar319 + fVar175 * fVar333) + fVar174;
    fVar304 = fVar304 + fVar176;
    fVar313 = fVar313 + auVar167._8_4_;
    fVar315 = fVar315 + auVar167._12_4_;
    auVar306._8_4_ = auVar167._8_4_;
    auVar306._0_8_ = auVar167._0_8_;
    auVar306._12_4_ = auVar167._12_4_;
    auVar15._4_4_ = fVar304;
    auVar15._0_4_ = fVar174;
    auVar15._8_4_ = fVar313;
    auVar15._12_4_ = fVar315;
    auVar233 = maxps(auVar306,auVar15);
    auVar214._8_4_ = auVar265._8_4_;
    auVar214._0_8_ = auVar265._0_8_;
    auVar214._12_4_ = 0;
    auVar20._4_4_ = auVar167._8_4_;
    auVar20._0_4_ = fVar176;
    auVar20._8_4_ = auVar167._12_4_;
    auVar20._12_4_ = 0;
    auVar77 = maxps(auVar214,auVar20);
    auVar307 = maxps(auVar233,auVar77);
    auVar16._4_4_ = fVar304;
    auVar16._0_4_ = fVar174;
    auVar16._8_4_ = fVar313;
    auVar16._12_4_ = fVar315;
    auVar77 = minps(auVar167,auVar16);
    auVar21._4_4_ = auVar167._8_4_;
    auVar21._0_4_ = fVar176;
    auVar21._8_4_ = auVar167._12_4_;
    auVar21._12_4_ = 0;
    auVar233 = minps(auVar265,auVar21);
    auVar233 = minps(auVar77,auVar233);
    auVar77 = sqrtps(auVar97 >> 0x20,auVar232);
    auVar232 = rsqrtps(auVar77,auVar282);
    fVar342 = auVar232._0_4_;
    fVar352 = auVar232._4_4_;
    fVar355 = auVar232._8_4_;
    fVar358 = auVar232._12_4_;
    fVar294 = fVar342 * 1.5 - fVar342 * fVar342 * auVar282._0_4_ * 0.5 * fVar342;
    fVar249 = fVar352 * 1.5 - fVar352 * fVar352 * auVar282._4_4_ * 0.5 * fVar352;
    fVar298 = fVar355 * 1.5 - fVar355 * fVar355 * auVar282._8_4_ * 0.5 * fVar355;
    fVar304 = fVar358 * 1.5 - fVar358 * fVar358 * auVar282._12_4_ * 0.5 * fVar358;
    fVar313 = 0.0 - fVar179;
    fVar315 = 0.0 - fVar199;
    fVar316 = 0.0 - fVar203;
    fVar290 = 0.0 - fVar206;
    fVar357 = 0.0 - fVar180;
    fVar331 = 0.0 - fVar200;
    fVar336 = 0.0 - fVar204;
    fVar340 = 0.0 - fVar207;
    fVar342 = 0.0 - fVar362;
    fVar358 = 0.0 - fVar366;
    fVar369 = 0.0 - fVar370;
    fVar174 = 0.0 - fVar374;
    auVar215._0_4_ = fVar313 * fVar313 + fVar357 * fVar357;
    auVar215._4_4_ = fVar315 * fVar315 + fVar331 * fVar331;
    auVar215._8_4_ = fVar316 * fVar316 + fVar336 * fVar336;
    auVar215._12_4_ = fVar290 * fVar290 + fVar340 * fVar340;
    fVar226 = fVar163 * fVar377 * fVar294 +
              (float)local_6c8._4_4_ * fVar224 * fVar294 + fVar165 * fVar363 * fVar294;
    fVar229 = fVar163 * fVar379 * fVar249 +
              (float)local_6c8._4_4_ * fVar227 * fVar249 + fVar165 * fVar367 * fVar249;
    fVar278 = fVar163 * fVar381 * fVar298 +
              (float)local_6c8._4_4_ * fVar246 * fVar298 + fVar165 * fVar371 * fVar298;
    fVar248 = fVar163 * fVar383 * fVar304 +
              (float)local_6c8._4_4_ * fVar289 * fVar304 + fVar165 * fVar375 * fVar304;
    fVar378 = fVar377 * fVar294 * fVar342 +
              fVar224 * fVar294 * fVar313 + fVar363 * fVar294 * fVar357;
    fVar380 = fVar379 * fVar249 * fVar358 +
              fVar227 * fVar249 * fVar315 + fVar367 * fVar249 * fVar331;
    fVar382 = fVar381 * fVar298 * fVar369 +
              fVar246 * fVar298 * fVar316 + fVar371 * fVar298 * fVar336;
    fVar384 = fVar383 * fVar304 * fVar174 +
              fVar289 * fVar304 * fVar290 + fVar375 * fVar304 * fVar340;
    fVar295 = (fVar163 * fVar342 + (float)local_6c8._4_4_ * fVar313 + fVar165 * fVar357) -
              fVar226 * fVar378;
    fVar299 = (fVar163 * fVar358 + (float)local_6c8._4_4_ * fVar315 + fVar165 * fVar331) -
              fVar229 * fVar380;
    fVar326 = (fVar163 * fVar369 + (float)local_6c8._4_4_ * fVar316 + fVar165 * fVar336) -
              fVar278 * fVar382;
    fVar330 = (fVar163 * fVar174 + (float)local_6c8._4_4_ * fVar290 + fVar165 * fVar340) -
              fVar248 * fVar384;
    fVar355 = (fVar342 * fVar342 + auVar215._0_4_) - fVar378 * fVar378;
    fVar365 = (fVar358 * fVar358 + auVar215._4_4_) - fVar380 * fVar380;
    fVar172 = (fVar369 * fVar369 + auVar215._8_4_) - fVar382 * fVar382;
    fVar175 = (fVar174 * fVar174 + auVar215._12_4_) - fVar384 * fVar384;
    fVar352 = (auVar307._0_4_ + auVar77._0_4_) * 1.0000002;
    fVar361 = (auVar307._4_4_ + auVar77._4_4_) * 1.0000002;
    fVar373 = (auVar307._8_4_ + auVar77._8_4_) * 1.0000002;
    fVar176 = (auVar307._12_4_ + auVar77._12_4_) * 1.0000002;
    fVar360 = fVar355 - fVar352 * fVar352;
    fVar332 = fVar365 - fVar361 * fVar361;
    fVar337 = fVar172 - fVar373 * fVar373;
    fVar341 = fVar175 - fVar176 * fVar176;
    fVar364 = fVar226 * fVar226;
    fVar368 = fVar229 * fVar229;
    fVar352 = fVar321 - fVar364;
    fVar361 = fVar324 - fVar368;
    fVar373 = fVar328 - fVar278 * fVar278;
    fVar176 = fVar124 - fVar248 * fVar248;
    fVar295 = fVar295 + fVar295;
    fVar299 = fVar299 + fVar299;
    fVar326 = fVar326 + fVar326;
    fVar330 = fVar330 + fVar330;
    fVar335 = fVar295 * fVar295 - fVar352 * 4.0 * fVar360;
    fVar339 = fVar299 * fVar299 - fVar361 * 4.0 * fVar332;
    fVar344 = fVar326 * fVar326 - fVar373 * 4.0 * fVar337;
    fVar354 = fVar330 * fVar330 - fVar176 * 4.0 * fVar341;
    local_478._4_4_ = (auVar233._4_4_ - auVar77._4_4_) * 0.99999976;
    local_478._0_4_ = (auVar233._0_4_ - auVar77._0_4_) * 0.99999976;
    fStack_470 = (auVar233._8_4_ - auVar77._8_4_) * 0.99999976;
    fStack_46c = (auVar233._12_4_ - auVar77._12_4_) * 0.99999976;
    auVar236._4_4_ = -(uint)(0.0 <= fVar339);
    auVar236._0_4_ = -(uint)(0.0 <= fVar335);
    auVar236._8_4_ = -(uint)(0.0 <= fVar344);
    auVar236._12_4_ = -(uint)(0.0 <= fVar354);
    uVar56 = (undefined4)((ulong)pSVar58 >> 0x20);
    iVar53 = movmskps((int)pSVar58,auVar236);
    uVar68 = CONCAT44(fVar299,fVar295) ^ 0x8000000080000000;
    fVar372 = ABS(fVar278 * fVar278);
    fVar376 = ABS(fVar248 * fVar248);
    fVar177 = ABS(fVar352);
    fVar202 = ABS(fVar361);
    fVar205 = ABS(fVar373);
    fVar210 = ABS(fVar176);
    if (iVar53 == 0) {
      iVar53 = 0;
      auVar100 = _DAT_01f45a40;
      auVar283 = _DAT_01f45a30;
    }
    else {
      auVar18._4_4_ = fVar339;
      auVar18._0_4_ = fVar335;
      auVar18._8_4_ = fVar344;
      auVar18._12_4_ = fVar354;
      auVar232 = sqrtps(_local_6c8,auVar18);
      bVar69 = 0.0 <= fVar335;
      uVar71 = -(uint)bVar69;
      bVar12 = 0.0 <= fVar339;
      uVar72 = -(uint)bVar12;
      bVar13 = 0.0 <= fVar344;
      uVar73 = -(uint)bVar13;
      bVar14 = 0.0 <= fVar354;
      uVar74 = -(uint)bVar14;
      auVar98._0_4_ = fVar352 + fVar352;
      auVar98._4_4_ = fVar361 + fVar361;
      auVar98._8_4_ = fVar373 + fVar373;
      auVar98._12_4_ = fVar176 + fVar176;
      auVar77 = rcpps(auVar215,auVar98);
      fVar279 = auVar77._0_4_;
      fVar291 = auVar77._4_4_;
      fVar296 = auVar77._8_4_;
      fVar300 = auVar77._12_4_;
      fVar279 = (1.0 - auVar98._0_4_ * fVar279) * fVar279 + fVar279;
      fVar291 = (1.0 - auVar98._4_4_ * fVar291) * fVar291 + fVar291;
      fVar296 = (1.0 - auVar98._8_4_ * fVar296) * fVar296 + fVar296;
      fVar300 = (1.0 - auVar98._12_4_ * fVar300) * fVar300 + fVar300;
      fVar335 = (-fVar295 - auVar232._0_4_) * fVar279;
      fVar339 = (-fVar299 - auVar232._4_4_) * fVar291;
      fVar344 = (-fVar326 - auVar232._8_4_) * fVar296;
      fVar354 = (-fVar330 - auVar232._12_4_) * fVar300;
      fVar279 = (auVar232._0_4_ - fVar295) * fVar279;
      fVar291 = (auVar232._4_4_ - fVar299) * fVar291;
      fVar296 = (auVar232._8_4_ - fVar326) * fVar296;
      fVar300 = (auVar232._12_4_ - fVar330) * fVar300;
      local_218 = (fVar226 * fVar335 + fVar378) * fVar294;
      fStack_214 = (fVar229 * fVar339 + fVar380) * fVar249;
      fStack_210 = (fVar278 * fVar344 + fVar382) * fVar298;
      fStack_20c = (fVar248 * fVar354 + fVar384) * fVar304;
      local_208 = (fVar226 * fVar279 + fVar378) * fVar294;
      fStack_204 = (fVar229 * fVar291 + fVar380) * fVar249;
      fStack_200 = (fVar278 * fVar296 + fVar382) * fVar298;
      fStack_1fc = (fVar248 * fVar300 + fVar384) * fVar304;
      auVar99._0_4_ = (uint)fVar335 & uVar71;
      auVar99._4_4_ = (uint)fVar339 & uVar72;
      auVar99._8_4_ = (uint)fVar344 & uVar73;
      auVar99._12_4_ = (uint)fVar354 & uVar74;
      auVar283._0_8_ = CONCAT44(~uVar72,~uVar71) & 0x7f8000007f800000;
      auVar283._8_4_ = ~uVar73 & 0x7f800000;
      auVar283._12_4_ = ~uVar74 & 0x7f800000;
      auVar283 = auVar283 | auVar99;
      auVar349._0_4_ = (uint)fVar279 & uVar71;
      auVar349._4_4_ = (uint)fVar291 & uVar72;
      auVar349._8_4_ = (uint)fVar296 & uVar73;
      auVar349._12_4_ = (uint)fVar300 & uVar74;
      auVar100._0_8_ = CONCAT44(~uVar72,~uVar71) & 0xff800000ff800000;
      auVar100._8_4_ = ~uVar73 & 0xff800000;
      auVar100._12_4_ = ~uVar74 & 0xff800000;
      auVar100 = auVar100 | auVar349;
      auVar31._4_4_ = fVar245;
      auVar31._0_4_ = fVar198;
      auVar31._8_4_ = fVar247;
      auVar31._12_4_ = fVar277;
      auVar19._8_4_ = fVar372;
      auVar19._0_8_ = CONCAT44(fVar368,fVar364) & 0x7fffffff7fffffff;
      auVar19._12_4_ = fVar376;
      auVar77 = maxps(auVar31,auVar19);
      fVar335 = auVar77._0_4_ * 1.9073486e-06;
      fVar339 = auVar77._4_4_ * 1.9073486e-06;
      fVar344 = auVar77._8_4_ * 1.9073486e-06;
      fVar354 = auVar77._12_4_ * 1.9073486e-06;
      auVar350._0_4_ = -(uint)(fVar177 < fVar335 && bVar69);
      auVar350._4_4_ = -(uint)(fVar202 < fVar339 && bVar12);
      auVar350._8_4_ = -(uint)(fVar205 < fVar344 && bVar13);
      auVar350._12_4_ = -(uint)(fVar210 < fVar354 && bVar14);
      iVar53 = movmskps(iVar53,auVar350);
      if (iVar53 != 0) {
        uVar71 = -(uint)(fVar360 <= 0.0);
        uVar72 = -(uint)(fVar332 <= 0.0);
        uVar73 = -(uint)(fVar337 <= 0.0);
        uVar74 = -(uint)(fVar341 <= 0.0);
        auVar221._0_4_ = (uVar71 & 0xff800000 | ~uVar71 & 0x7f800000) & auVar350._0_4_;
        auVar221._4_4_ = (uVar72 & 0xff800000 | ~uVar72 & 0x7f800000) & auVar350._4_4_;
        auVar221._8_4_ = (uVar73 & 0xff800000 | ~uVar73 & 0x7f800000) & auVar350._8_4_;
        auVar221._12_4_ = (uVar74 & 0xff800000 | ~uVar74 & 0x7f800000) & auVar350._12_4_;
        auVar310._0_4_ = ~auVar350._0_4_ & auVar283._0_4_;
        auVar310._4_4_ = ~auVar350._4_4_ & auVar283._4_4_;
        auVar310._8_4_ = ~auVar350._8_4_ & auVar283._8_4_;
        auVar310._12_4_ = ~auVar350._12_4_ & auVar283._12_4_;
        auVar283 = auVar310 | auVar221;
        auVar222._0_8_ = CONCAT44(~uVar72,~uVar71) & 0xff800000ff800000;
        auVar222._8_4_ = ~uVar73 & 0xff800000;
        auVar222._12_4_ = ~uVar74 & 0xff800000;
        auVar243._0_8_ = CONCAT44(uVar72,uVar71) & 0x7f8000007f800000;
        auVar243._8_4_ = uVar73 & 0x7f800000;
        auVar243._12_4_ = uVar74 & 0x7f800000;
        auVar243 = auVar243 | auVar222;
        auVar244._0_4_ = auVar243._0_4_ & auVar350._0_4_;
        auVar244._4_4_ = auVar243._4_4_ & auVar350._4_4_;
        auVar244._8_4_ = auVar243._8_4_ & auVar350._8_4_;
        auVar244._12_4_ = auVar243._12_4_ & auVar350._12_4_;
        auVar351._0_4_ = ~auVar350._0_4_ & auVar100._0_4_;
        auVar351._4_4_ = ~auVar350._4_4_ & auVar100._4_4_;
        auVar351._8_4_ = ~auVar350._8_4_ & auVar100._8_4_;
        auVar351._12_4_ = ~auVar350._12_4_ & auVar100._12_4_;
        auVar100 = auVar351 | auVar244;
        auVar236._4_4_ = -(uint)((fVar339 <= fVar202 || fVar332 <= 0.0) && bVar12);
        auVar236._0_4_ = -(uint)((fVar335 <= fVar177 || fVar360 <= 0.0) && bVar69);
        auVar236._8_4_ = -(uint)((fVar344 <= fVar205 || fVar337 <= 0.0) && bVar13);
        auVar236._12_4_ = -(uint)((fVar354 <= fVar210 || fVar341 <= 0.0) && bVar14);
      }
    }
    auVar237._0_4_ = (auVar236._0_4_ << 0x1f) >> 0x1f;
    auVar237._4_4_ = (auVar236._4_4_ << 0x1f) >> 0x1f;
    auVar237._8_4_ = (auVar236._8_4_ << 0x1f) >> 0x1f;
    auVar237._12_4_ = (auVar236._12_4_ << 0x1f) >> 0x1f;
    auVar237 = auVar237 & auVar139;
    iVar53 = movmskps(iVar53,auVar237);
    uVar60 = CONCAT44(uVar56,iVar53);
    fVar335 = local_5c8;
    fVar339 = fStack_5c4;
    fVar344 = fStack_5c0;
    fVar354 = fStack_5bc;
    if (iVar53 != 0) {
      fVar360 = *(float *)(ray + k * 4 + 0x80);
      auVar308._0_4_ = fVar360 - fVar208;
      auVar308._4_4_ = auVar308._0_4_;
      auVar308._8_4_ = auVar308._0_4_;
      auVar308._12_4_ = auVar308._0_4_;
      auVar233 = minps(auVar308,auVar100);
      auVar35._4_4_ = fVar228;
      auVar35._0_4_ = fVar228;
      auVar35._8_4_ = fVar228;
      auVar35._12_4_ = fVar228;
      auVar232 = maxps(auVar35,auVar283);
      auVar101._0_4_ = fVar325 * (float)local_6c8._4_4_ + fVar343 * fVar165;
      auVar101._4_4_ = fVar329 * (float)local_6c8._4_4_ + fVar353 * fVar165;
      auVar101._8_4_ = fVar334 * (float)local_6c8._4_4_ + fVar356 * fVar165;
      auVar101._12_4_ = fVar338 * (float)local_6c8._4_4_ + fVar359 * fVar165;
      auVar183._0_4_ = fVar318 * fVar163 + auVar101._0_4_;
      auVar183._4_4_ = fVar320 * fVar163 + auVar101._4_4_;
      auVar183._8_4_ = fVar322 * fVar163 + auVar101._8_4_;
      auVar183._12_4_ = fVar323 * fVar163 + auVar101._12_4_;
      auVar77 = rcpps(auVar101,auVar183);
      fVar332 = auVar77._0_4_;
      fVar337 = auVar77._4_4_;
      fVar341 = auVar77._8_4_;
      fVar279 = auVar77._12_4_;
      fVar291 = (float)DAT_01f4bd50;
      fVar296 = DAT_01f4bd50._4_4_;
      fVar300 = DAT_01f4bd50._8_4_;
      fVar301 = DAT_01f4bd50._12_4_;
      fVar342 = ((1.0 - auVar183._0_4_ * fVar332) * fVar332 + fVar332) *
                -(fVar342 * fVar318 + fVar313 * fVar325 + fVar357 * fVar343);
      fVar358 = ((1.0 - auVar183._4_4_ * fVar337) * fVar337 + fVar337) *
                -(fVar358 * fVar320 + fVar315 * fVar329 + fVar331 * fVar353);
      fVar369 = ((1.0 - auVar183._8_4_ * fVar341) * fVar341 + fVar341) *
                -(fVar369 * fVar322 + fVar316 * fVar334 + fVar336 * fVar356);
      fVar174 = ((1.0 - auVar183._12_4_ * fVar279) * fVar279 + fVar279) *
                -(fVar174 * fVar323 + fVar290 * fVar338 + fVar340 * fVar359);
      uVar71 = -(uint)(auVar183._0_4_ < 0.0 || ABS(auVar183._0_4_) < fVar291);
      uVar72 = -(uint)(auVar183._4_4_ < 0.0 || ABS(auVar183._4_4_) < fVar296);
      uVar73 = -(uint)(auVar183._8_4_ < 0.0 || ABS(auVar183._8_4_) < fVar300);
      uVar74 = -(uint)(auVar183._12_4_ < 0.0 || ABS(auVar183._12_4_) < fVar301);
      auVar266._0_8_ = CONCAT44(uVar72,uVar71) & 0xff800000ff800000;
      auVar266._8_4_ = uVar73 & 0xff800000;
      auVar266._12_4_ = uVar74 & 0xff800000;
      auVar102._0_4_ = ~uVar71 & (uint)fVar342;
      auVar102._4_4_ = ~uVar72 & (uint)fVar358;
      auVar102._8_4_ = ~uVar73 & (uint)fVar369;
      auVar102._12_4_ = ~uVar74 & (uint)fVar174;
      auVar77 = maxps(auVar232,auVar102 | auVar266);
      uVar71 = -(uint)(0.0 < auVar183._0_4_ || ABS(auVar183._0_4_) < fVar291);
      uVar72 = -(uint)(0.0 < auVar183._4_4_ || ABS(auVar183._4_4_) < fVar296);
      uVar73 = -(uint)(0.0 < auVar183._8_4_ || ABS(auVar183._8_4_) < fVar300);
      uVar74 = -(uint)(0.0 < auVar183._12_4_ || ABS(auVar183._12_4_) < fVar301);
      auVar103._0_8_ = CONCAT44(uVar72,uVar71) & 0x7f8000007f800000;
      auVar103._8_4_ = uVar73 & 0x7f800000;
      auVar103._12_4_ = uVar74 & 0x7f800000;
      auVar184._0_4_ = ~uVar71 & (uint)fVar342;
      auVar184._4_4_ = ~uVar72 & (uint)fVar358;
      auVar184._8_4_ = ~uVar73 & (uint)fVar369;
      auVar184._12_4_ = ~uVar74 & (uint)fVar174;
      auVar233 = minps(auVar233,auVar184 | auVar103);
      auVar185._0_4_ = (0.0 - fVar199) * -fVar329 + (0.0 - fVar200) * -fVar353;
      auVar185._4_4_ = (0.0 - fVar203) * -fVar334 + (0.0 - fVar204) * -fVar356;
      auVar185._8_4_ = (0.0 - fVar206) * -fVar338 + (0.0 - fVar207) * -fVar359;
      auVar185._12_4_ = 0x80000000;
      auVar141._0_4_ = -fVar320 * fVar163 + -fVar329 * (float)local_6c8._4_4_ + -fVar353 * fVar165;
      auVar141._4_4_ = -fVar322 * fVar163 + -fVar334 * (float)local_6c8._4_4_ + -fVar356 * fVar165;
      auVar141._8_4_ = -fVar323 * fVar163 + -fVar338 * (float)local_6c8._4_4_ + -fVar359 * fVar165;
      auVar141._12_4_ = fVar163 * -0.0 + (float)local_6c8._4_4_ * -0.0 + fVar165 * -0.0;
      auVar232 = rcpps(auVar185,auVar141);
      fVar342 = auVar232._0_4_;
      fVar358 = auVar232._4_4_;
      fVar369 = auVar232._8_4_;
      fVar174 = auVar232._12_4_;
      auVar216._4_4_ = -(uint)(ABS(auVar141._4_4_) < fVar296);
      auVar216._0_4_ = -(uint)(ABS(auVar141._0_4_) < fVar291);
      auVar216._8_4_ = -(uint)(ABS(auVar141._8_4_) < fVar300);
      auVar216._12_4_ = -(uint)(ABS(auVar141._12_4_) < fVar301);
      fVar313 = 0.0;
      fVar315 = 0.0;
      fVar316 = 0.0;
      fVar290 = 0.0;
      fVar342 = (((float)DAT_01f46a60 - auVar141._0_4_ * fVar342) * fVar342 + fVar342) *
                -((0.0 - fVar366) * -fVar320 + auVar185._0_4_);
      fVar358 = ((DAT_01f46a60._4_4_ - auVar141._4_4_ * fVar358) * fVar358 + fVar358) *
                -((0.0 - fVar370) * -fVar322 + auVar185._4_4_);
      fVar369 = ((DAT_01f46a60._8_4_ - auVar141._8_4_ * fVar369) * fVar369 + fVar369) *
                -((0.0 - fVar374) * -fVar323 + auVar185._8_4_);
      fVar174 = ((DAT_01f46a60._12_4_ - auVar141._12_4_ * fVar174) * fVar174 + fVar174) * 0.0;
      auVar104._4_4_ = -(uint)(auVar141._4_4_ < 0.0);
      auVar104._0_4_ = -(uint)(auVar141._0_4_ < 0.0);
      auVar104._8_4_ = -(uint)(auVar141._8_4_ < 0.0);
      auVar104._12_4_ = -(uint)(auVar141._12_4_ < 0.0);
      auVar104 = auVar104 | auVar216;
      auVar186._0_8_ = auVar104._0_8_ & 0xff800000ff800000;
      auVar186._8_4_ = auVar104._8_4_ & 0xff800000;
      auVar186._12_4_ = auVar104._12_4_ & 0xff800000;
      auVar105._0_4_ = ~auVar104._0_4_ & (uint)fVar342;
      auVar105._4_4_ = ~auVar104._4_4_ & (uint)fVar358;
      auVar105._8_4_ = ~auVar104._8_4_ & (uint)fVar369;
      auVar105._12_4_ = ~auVar104._12_4_ & (uint)fVar174;
      local_5a8 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar77,auVar105 | auVar186);
      auVar142._4_4_ = -(uint)(0.0 < auVar141._4_4_);
      auVar142._0_4_ = -(uint)(0.0 < auVar141._0_4_);
      auVar142._8_4_ = -(uint)(0.0 < auVar141._8_4_);
      auVar142._12_4_ = -(uint)(0.0 < auVar141._12_4_);
      auVar142 = auVar142 | auVar216;
      auVar106._0_8_ = auVar142._0_8_ & 0x7f8000007f800000;
      auVar106._8_4_ = auVar142._8_4_ & 0x7f800000;
      auVar106._12_4_ = auVar142._12_4_ & 0x7f800000;
      auVar143._0_4_ = ~auVar142._0_4_ & (uint)fVar342;
      auVar143._4_4_ = ~auVar142._4_4_ & (uint)fVar358;
      auVar143._8_4_ = ~auVar142._8_4_ & (uint)fVar369;
      auVar143._12_4_ = ~auVar142._12_4_ & (uint)fVar174;
      tp1.upper.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)minps(auVar233,auVar143 | auVar106);
      fVar174 = local_5a8.v[3];
      fVar342 = local_5a8.v[0];
      fVar358 = local_5a8.v[1];
      fVar369 = local_5a8.v[2];
      auVar144._0_4_ = -(uint)(fVar342 <= tp1.upper.field_0._0_4_) & auVar237._0_4_;
      auVar144._4_4_ = -(uint)(fVar358 <= tp1.upper.field_0._4_4_) & auVar237._4_4_;
      auVar144._8_4_ = -(uint)(fVar369 <= tp1.upper.field_0._8_4_) & auVar237._8_4_;
      auVar144._12_4_ = -(uint)(fVar174 <= tp1.upper.field_0._12_4_) & auVar237._12_4_;
      iVar53 = movmskps(iVar53,auVar144);
      uVar60 = CONCAT44(uVar56,iVar53);
      if (iVar53 != 0) {
        auVar77 = maxps(ZEXT816(0),_local_478);
        auVar33._4_4_ = fStack_214;
        auVar33._0_4_ = local_218;
        auVar33._8_4_ = fStack_210;
        auVar33._12_4_ = fStack_20c;
        auVar232 = minps(auVar33,_DAT_01f46a60);
        _local_668 = ZEXT812(0);
        fStack_65c = 0.0;
        auVar233 = maxps(auVar232,_local_668);
        auVar34._4_4_ = fStack_204;
        auVar34._0_4_ = local_208;
        auVar34._8_4_ = fStack_200;
        auVar34._12_4_ = fStack_1fc;
        auVar232 = minps(auVar34,_DAT_01f46a60);
        auVar232 = maxps(auVar232,_local_668);
        local_108[0] = (auVar233._0_4_ + 0.0) * 0.25 * fVar209 + fVar171;
        local_108[1] = (auVar233._4_4_ + 1.0) * 0.25 * fVar209 + fVar171;
        local_108[2] = (auVar233._8_4_ + 2.0) * 0.25 * fVar209 + fVar171;
        local_108[3] = (auVar233._12_4_ + 3.0) * 0.25 * fVar209 + fVar171;
        local_118[0] = (auVar232._0_4_ + 0.0) * 0.25 * fVar209 + fVar171;
        local_118[1] = (auVar232._4_4_ + 1.0) * 0.25 * fVar209 + fVar171;
        local_118[2] = (auVar232._8_4_ + 2.0) * 0.25 * fVar209 + fVar171;
        local_118[3] = (auVar232._12_4_ + 3.0) * 0.25 * fVar209 + fVar171;
        fVar355 = fVar355 - auVar77._0_4_ * auVar77._0_4_;
        fVar365 = fVar365 - auVar77._4_4_ * auVar77._4_4_;
        auVar107._4_4_ = fVar365;
        auVar107._0_4_ = fVar355;
        fVar172 = fVar172 - auVar77._8_4_ * auVar77._8_4_;
        fVar175 = fVar175 - auVar77._12_4_ * auVar77._12_4_;
        auVar107._8_4_ = fVar172;
        auVar107._12_4_ = fVar175;
        auVar309._0_4_ = fVar295 * fVar295 - fVar352 * 4.0 * fVar355;
        auVar309._4_4_ = fVar299 * fVar299 - fVar361 * 4.0 * fVar365;
        auVar309._8_4_ = fVar326 * fVar326 - fVar373 * 4.0 * fVar172;
        auVar309._12_4_ = fVar330 * fVar330 - fVar176 * 4.0 * fVar175;
        auVar187._4_4_ = -(uint)(0.0 <= auVar309._4_4_);
        auVar187._0_4_ = -(uint)(0.0 <= auVar309._0_4_);
        auVar187._8_4_ = -(uint)(0.0 <= auVar309._8_4_);
        auVar187._12_4_ = -(uint)(0.0 <= auVar309._12_4_);
        iVar53 = movmskps(iVar53,auVar187);
        if (iVar53 == 0) {
          _local_688 = ZEXT816(0);
          fVar352 = 0.0;
          fVar361 = 0.0;
          fVar373 = 0.0;
          fVar176 = 0.0;
          fVar179 = 0.0;
          fVar180 = 0.0;
          fVar224 = 0.0;
          fVar226 = 0.0;
          _local_5d8 = ZEXT816(0);
          iVar53 = 0;
          auVar108 = _DAT_01f45a40;
          auVar284 = _DAT_01f45a30;
        }
        else {
          auVar232 = sqrtps(_local_5d8,auVar309);
          auVar145._0_4_ = fVar352 + fVar352;
          auVar145._4_4_ = fVar361 + fVar361;
          auVar145._8_4_ = fVar373 + fVar373;
          auVar145._12_4_ = fVar176 + fVar176;
          auVar77 = rcpps(auVar107,auVar145);
          fVar209 = auVar77._0_4_;
          fVar318 = auVar77._4_4_;
          fVar320 = auVar77._8_4_;
          fVar322 = auVar77._12_4_;
          fVar209 = ((float)DAT_01f46a60 - auVar145._0_4_ * fVar209) * fVar209 + fVar209;
          fVar318 = (DAT_01f46a60._4_4_ - auVar145._4_4_ * fVar318) * fVar318 + fVar318;
          fVar320 = (DAT_01f46a60._8_4_ - auVar145._8_4_ * fVar320) * fVar320 + fVar320;
          fVar322 = (DAT_01f46a60._12_4_ - auVar145._12_4_ * fVar322) * fVar322 + fVar322;
          local_1a8 = (float)uVar68;
          fStack_1a4 = (float)(uVar68 >> 0x20);
          fVar323 = (local_1a8 - auVar232._0_4_) * fVar209;
          fVar325 = (fStack_1a4 - auVar232._4_4_) * fVar318;
          fVar357 = (-fVar326 - auVar232._8_4_) * fVar320;
          fVar329 = (-fVar330 - auVar232._12_4_) * fVar322;
          fVar209 = (auVar232._0_4_ - fVar295) * fVar209;
          fVar318 = (auVar232._4_4_ - fVar299) * fVar318;
          fVar320 = (auVar232._8_4_ - fVar326) * fVar320;
          fVar322 = (auVar232._12_4_ - fVar330) * fVar322;
          fVar352 = (fVar226 * fVar323 + fVar378) * fVar294;
          fVar361 = (fVar229 * fVar325 + fVar380) * fVar249;
          fVar373 = (fVar278 * fVar357 + fVar382) * fVar298;
          fVar176 = (fVar248 * fVar329 + fVar384) * fVar304;
          local_668._4_4_ = fVar163 * fVar325 - (fVar379 * fVar361 + fVar366);
          local_668._0_4_ = fVar163 * fVar323 - (fVar377 * fVar352 + fVar362);
          fStack_660 = fVar163 * fVar357 - (fVar381 * fVar373 + fVar370);
          fStack_65c = fVar163 * fVar329 - (fVar383 * fVar176 + fVar374);
          fVar313 = (float)local_6c8._4_4_ * fVar323 - (fVar224 * fVar352 + fVar179);
          fVar315 = (float)local_6c8._4_4_ * fVar325 - (fVar227 * fVar361 + fVar199);
          fVar316 = (float)local_6c8._4_4_ * fVar357 - (fVar246 * fVar373 + fVar203);
          fVar290 = (float)local_6c8._4_4_ * fVar329 - (fVar289 * fVar176 + fVar206);
          local_5d8._4_4_ = fVar165 * fVar325 - (fVar361 * fVar367 + fVar200);
          local_5d8._0_4_ = fVar165 * fVar323 - (fVar352 * fVar363 + fVar180);
          fStack_5d0 = fVar165 * fVar357 - (fVar373 * fVar371 + fVar204);
          fStack_5cc = fVar165 * fVar329 - (fVar176 * fVar375 + fVar207);
          fVar294 = (fVar226 * fVar209 + fVar378) * fVar294;
          fVar249 = (fVar229 * fVar318 + fVar380) * fVar249;
          fVar298 = (fVar278 * fVar320 + fVar382) * fVar298;
          fVar304 = (fVar248 * fVar322 + fVar384) * fVar304;
          local_688._4_4_ = fVar163 * fVar318 - (fVar379 * fVar249 + fVar366);
          local_688._0_4_ = fVar163 * fVar209 - (fVar377 * fVar294 + fVar362);
          fStack_680 = fVar163 * fVar320 - (fVar381 * fVar298 + fVar370);
          fStack_67c = fVar163 * fVar322 - (fVar383 * fVar304 + fVar374);
          fVar352 = (float)local_6c8._4_4_ * fVar209 - (fVar224 * fVar294 + fVar179);
          fVar361 = (float)local_6c8._4_4_ * fVar318 - (fVar227 * fVar249 + fVar199);
          fVar373 = (float)local_6c8._4_4_ * fVar320 - (fVar246 * fVar298 + fVar203);
          fVar176 = (float)local_6c8._4_4_ * fVar322 - (fVar289 * fVar304 + fVar206);
          bVar69 = 0.0 <= auVar309._0_4_;
          uVar71 = -(uint)bVar69;
          bVar12 = 0.0 <= auVar309._4_4_;
          uVar72 = -(uint)bVar12;
          bVar13 = 0.0 <= auVar309._8_4_;
          uVar73 = -(uint)bVar13;
          bVar14 = 0.0 <= auVar309._12_4_;
          uVar74 = -(uint)bVar14;
          fVar179 = fVar165 * fVar209 - (fVar294 * fVar363 + fVar180);
          fVar180 = fVar165 * fVar318 - (fVar249 * fVar367 + fVar200);
          fVar224 = fVar165 * fVar320 - (fVar298 * fVar371 + fVar204);
          fVar226 = fVar165 * fVar322 - (fVar304 * fVar375 + fVar207);
          auVar146._0_4_ = (uint)fVar323 & uVar71;
          auVar146._4_4_ = (uint)fVar325 & uVar72;
          auVar146._8_4_ = (uint)fVar357 & uVar73;
          auVar146._12_4_ = (uint)fVar329 & uVar74;
          auVar284._0_8_ = CONCAT44(~uVar72,~uVar71) & 0x7f8000007f800000;
          auVar284._8_4_ = ~uVar73 & 0x7f800000;
          auVar284._12_4_ = ~uVar74 & 0x7f800000;
          auVar284 = auVar284 | auVar146;
          auVar267._0_4_ = (uint)fVar209 & uVar71;
          auVar267._4_4_ = (uint)fVar318 & uVar72;
          auVar267._8_4_ = (uint)fVar320 & uVar73;
          auVar267._12_4_ = (uint)fVar322 & uVar74;
          auVar108._0_8_ = CONCAT44(~uVar72,~uVar71) & 0xff800000ff800000;
          auVar108._8_4_ = ~uVar73 & 0xff800000;
          auVar108._12_4_ = ~uVar74 & 0xff800000;
          auVar108 = auVar108 | auVar267;
          auVar32._4_4_ = fVar245;
          auVar32._0_4_ = fVar198;
          auVar32._8_4_ = fVar247;
          auVar32._12_4_ = fVar277;
          auVar36._8_4_ = fVar372;
          auVar36._0_8_ = CONCAT44(fVar368,fVar364) & 0x7fffffff7fffffff;
          auVar36._12_4_ = fVar376;
          auVar77 = maxps(auVar32,auVar36);
          fVar199 = auVar77._0_4_ * 1.9073486e-06;
          fVar200 = auVar77._4_4_ * 1.9073486e-06;
          fVar227 = auVar77._8_4_ * 1.9073486e-06;
          fVar229 = auVar77._12_4_ * 1.9073486e-06;
          auVar268._0_4_ = -(uint)(fVar177 < fVar199 && bVar69);
          auVar268._4_4_ = -(uint)(fVar202 < fVar200 && bVar12);
          auVar268._8_4_ = -(uint)(fVar205 < fVar227 && bVar13);
          auVar268._12_4_ = -(uint)(fVar210 < fVar229 && bVar14);
          iVar53 = movmskps(iVar53,auVar268);
          if (iVar53 != 0) {
            uVar71 = -(uint)(fVar355 <= 0.0);
            uVar72 = -(uint)(fVar365 <= 0.0);
            uVar73 = -(uint)(fVar172 <= 0.0);
            uVar74 = -(uint)(fVar175 <= 0.0);
            auVar311._0_4_ = (uVar71 & 0xff800000 | ~uVar71 & 0x7f800000) & auVar268._0_4_;
            auVar311._4_4_ = (uVar72 & 0xff800000 | ~uVar72 & 0x7f800000) & auVar268._4_4_;
            auVar311._8_4_ = (uVar73 & 0xff800000 | ~uVar73 & 0x7f800000) & auVar268._8_4_;
            auVar311._12_4_ = (uVar74 & 0xff800000 | ~uVar74 & 0x7f800000) & auVar268._12_4_;
            auVar327._0_4_ = ~auVar268._0_4_ & auVar284._0_4_;
            auVar327._4_4_ = ~auVar268._4_4_ & auVar284._4_4_;
            auVar327._8_4_ = ~auVar268._8_4_ & auVar284._8_4_;
            auVar327._12_4_ = ~auVar268._12_4_ & auVar284._12_4_;
            auVar284 = auVar327 | auVar311;
            auVar287._0_4_ = (uVar71 & 0x7f800000 | ~uVar71 & 0xff800000) & auVar268._0_4_;
            auVar287._4_4_ = (uVar72 & 0x7f800000 | ~uVar72 & 0xff800000) & auVar268._4_4_;
            auVar287._8_4_ = (uVar73 & 0x7f800000 | ~uVar73 & 0xff800000) & auVar268._8_4_;
            auVar287._12_4_ = (uVar74 & 0x7f800000 | ~uVar74 & 0xff800000) & auVar268._12_4_;
            auVar271._0_4_ = ~auVar268._0_4_ & auVar108._0_4_;
            auVar271._4_4_ = ~auVar268._4_4_ & auVar108._4_4_;
            auVar271._8_4_ = ~auVar268._8_4_ & auVar108._8_4_;
            auVar271._12_4_ = ~auVar268._12_4_ & auVar108._12_4_;
            auVar108 = auVar271 | auVar287;
            auVar187._0_4_ = -(uint)((fVar199 <= fVar177 || fVar355 <= 0.0) && bVar69);
            auVar187._4_4_ = -(uint)((fVar200 <= fVar202 || fVar365 <= 0.0) && bVar12);
            auVar187._8_4_ = -(uint)((fVar227 <= fVar205 || fVar172 <= 0.0) && bVar13);
            auVar187._12_4_ = -(uint)((fVar229 <= fVar210 || fVar175 <= 0.0) && bVar14);
          }
        }
        auVar77 = minps((undefined1  [16])tp1.upper.field_0,auVar284);
        aVar285 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                  maxps((undefined1  [16])local_5a8,auVar108);
        tp1.lower.field_0 = aVar285;
        uVar71 = -(uint)(fVar342 <= auVar77._0_4_) & auVar144._0_4_;
        uVar72 = -(uint)(fVar358 <= auVar77._4_4_) & auVar144._4_4_;
        uVar76 = CONCAT44(uVar72,uVar71);
        uVar73 = -(uint)(fVar369 <= auVar77._8_4_) & auVar144._8_4_;
        uVar74 = -(uint)(fVar174 <= auVar77._12_4_) & auVar144._12_4_;
        uVar280 = -(uint)(aVar285.v[0] <= tp1.upper.field_0._0_4_) & auVar144._0_4_;
        uVar292 = -(uint)(aVar285.v[1] <= tp1.upper.field_0._4_4_) & auVar144._4_4_;
        auVar109._4_4_ = uVar292;
        auVar109._0_4_ = uVar280;
        uVar297 = -(uint)(aVar285.v[2] <= tp1.upper.field_0._8_4_) & auVar144._8_4_;
        uVar302 = -(uint)(aVar285.v[3] <= tp1.upper.field_0._12_4_) & auVar144._12_4_;
        auVar147._8_4_ = uVar73;
        auVar147._0_8_ = uVar76;
        auVar147._12_4_ = uVar74;
        auVar109._8_4_ = uVar297;
        auVar109._12_4_ = uVar302;
        iVar53 = movmskps(iVar53,auVar109 | auVar147);
        uVar60 = CONCAT44(uVar56,iVar53);
        if (iVar53 != 0) {
          auVar238._8_4_ = uVar73;
          auVar238._0_8_ = uVar76;
          auVar238._12_4_ = uVar74;
          local_5d8._0_4_ =
               -(uint)((int)local_6dc <
                      ((int)((-(uint)(0.3 <= ABS((float)local_5d8._0_4_ * fVar165 +
                                                 fVar313 * (float)local_6c8._4_4_ +
                                                 local_668._0_4_ * fVar163)) & auVar187._0_4_) <<
                            0x1f) >> 0x1f) + 4);
          local_5d8._4_4_ =
               -(uint)((int)local_6dc <
                      ((int)((-(uint)(0.3 <= ABS((float)local_5d8._4_4_ * fVar165 +
                                                 fVar315 * (float)local_6c8._4_4_ +
                                                 local_668._4_4_ * fVar163)) & auVar187._4_4_) <<
                            0x1f) >> 0x1f) + 4);
          fStack_5d0 = (float)-(uint)((int)local_6dc <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_5d0 * fVar165 +
                                                                fVar316 * (float)local_6c8._4_4_ +
                                                                local_668._8_4_ * fVar163)) &
                                            auVar187._8_4_) << 0x1f) >> 0x1f) + 4);
          fStack_5cc = (float)-(uint)((int)local_6dc <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_5cc * fVar165 +
                                                                fVar290 * (float)local_6c8._4_4_ +
                                                                local_668._12_4_ * fVar163)) &
                                            auVar187._12_4_) << 0x1f) >> 0x1f) + 4);
          auVar110 = ~_local_5d8 & auVar238;
          local_5b8 = local_5c8 + fVar342;
          fStack_5b4 = fStack_5c4 + fVar358;
          fStack_5b0 = fStack_5c0 + fVar369;
          fStack_5ac = fStack_5bc + fVar174;
          while( true ) {
            local_338 = auVar110;
            uVar56 = (undefined4)(uVar60 >> 0x20);
            iVar53 = movmskps((int)uVar60,auVar110);
            lVar62 = CONCAT44(uVar56,iVar53);
            if (iVar53 == 0) break;
            auVar232 = ~auVar110 & _DAT_01f45a30 | auVar110 & (undefined1  [16])local_5a8;
            auVar188._4_4_ = auVar232._0_4_;
            auVar188._0_4_ = auVar232._4_4_;
            auVar188._8_4_ = auVar232._12_4_;
            auVar188._12_4_ = auVar232._8_4_;
            auVar77 = minps(auVar188,auVar232);
            auVar148._0_8_ = auVar77._8_8_;
            auVar148._8_4_ = auVar77._0_4_;
            auVar148._12_4_ = auVar77._4_4_;
            auVar77 = minps(auVar148,auVar77);
            auVar149._0_8_ =
                 CONCAT44(-(uint)(auVar77._4_4_ == auVar232._4_4_) & auVar110._4_4_,
                          -(uint)(auVar77._0_4_ == auVar232._0_4_) & auVar110._0_4_);
            auVar149._8_4_ = -(uint)(auVar77._8_4_ == auVar232._8_4_) & auVar110._8_4_;
            auVar149._12_4_ = -(uint)(auVar77._12_4_ == auVar232._12_4_) & auVar110._12_4_;
            iVar53 = movmskps(iVar53,auVar149);
            if (iVar53 != 0) {
              auVar110._8_4_ = auVar149._8_4_;
              auVar110._0_8_ = auVar149._0_8_;
              auVar110._12_4_ = auVar149._12_4_;
            }
            uVar54 = movmskps(iVar53,auVar110);
            uVar68 = CONCAT44(uVar56,uVar54);
            uVar60 = 0;
            if (uVar68 != 0) {
              for (; (uVar68 >> uVar60 & 1) == 0; uVar60 = uVar60 + 1) {
              }
            }
            *(undefined4 *)(local_338 + uVar60 * 4) = 0;
            auVar23._4_4_ = fStack_594;
            auVar23._0_4_ = local_598;
            auVar23._8_4_ = fStack_590;
            auVar23._12_4_ = fStack_58c;
            auVar29._4_4_ = fVar288;
            auVar29._0_4_ = fVar273;
            auVar29._8_4_ = fVar293;
            auVar29._12_4_ = fVar303;
            auVar232 = minps(auVar23,auVar29);
            auVar233 = maxps(auVar23,auVar29);
            auVar27._4_4_ = fVar314;
            auVar27._0_4_ = fVar312;
            auVar27._8_4_ = fVar317;
            auVar27._12_4_ = fVar319;
            auVar25._4_4_ = fVar275;
            auVar25._0_4_ = fVar274;
            auVar25._8_4_ = fVar276;
            auVar25._12_4_ = fVar333;
            auVar77 = minps(auVar27,auVar25);
            auVar232 = minps(auVar232,auVar77);
            auVar77 = maxps(auVar27,auVar25);
            auVar233 = maxps(auVar233,auVar77);
            auVar189._0_8_ = auVar232._0_8_ & 0x7fffffff7fffffff;
            auVar189._8_4_ = auVar232._8_4_ & 0x7fffffff;
            auVar189._12_4_ = auVar232._12_4_ & 0x7fffffff;
            auVar111._0_8_ = auVar233._0_8_ & 0x7fffffff7fffffff;
            auVar111._8_4_ = auVar233._8_4_ & 0x7fffffff;
            auVar111._12_4_ = ABS(auVar233._12_4_);
            auVar77 = maxps(auVar189,auVar111);
            fVar355 = auVar77._4_4_;
            if (auVar77._4_4_ <= auVar77._0_4_) {
              fVar355 = auVar77._0_4_;
            }
            auVar190._8_8_ = auVar77._8_8_;
            auVar190._0_8_ = auVar77._8_8_;
            if (auVar77._8_4_ <= fVar355) {
              auVar190._0_4_ = fVar355;
            }
            fVar172 = auVar190._0_4_ * 1.9073486e-06;
            fVar355 = local_108[uVar60];
            fVar365 = local_118[uVar60 - 8];
            for (uVar68 = 0; uVar68 != 5; uVar68 = uVar68 + 1) {
              fVar177 = SQRT(fVar178) * 1.9073486e-06 * fVar365;
              fVar210 = 1.0 - fVar355;
              fVar199 = fVar355 * fVar210;
              fVar175 = fVar210 * fVar210 * fVar210;
              fVar229 = fVar355 * fVar355 * fVar355;
              fVar202 = fVar175 * 0.16666667;
              fVar227 = (fVar210 * fVar199 * 12.0 + fVar199 * fVar355 * 6.0 +
                        fVar175 * 4.0 + fVar229) * 0.16666667;
              fVar206 = (fVar199 * fVar355 * 12.0 + fVar210 * fVar199 * 6.0 +
                        fVar229 * 4.0 + fVar175) * 0.16666667;
              fVar229 = fVar229 * 0.16666667;
              fVar205 = fVar202 * fStack_58c +
                        fVar227 * fVar303 + fVar206 * fVar319 + fVar229 * fVar333;
              fVar203 = -fVar210 * fVar210 * 0.5;
              fVar200 = (-fVar355 * fVar355 - fVar199 * 4.0) * 0.5;
              fVar199 = (fVar210 * fVar210 + fVar199 * 4.0) * 0.5;
              fVar175 = fVar355 * fVar355 * 0.5;
              fVar204 = fVar203 * local_598 +
                        fVar200 * fVar273 + fVar199 * fVar312 + fVar175 * fVar274;
              fVar246 = fVar203 * fStack_594 +
                        fVar200 * fVar288 + fVar199 * fVar314 + fVar175 * fVar275;
              fVar278 = fVar203 * fStack_590 +
                        fVar200 * fVar293 + fVar199 * fVar317 + fVar175 * fVar276;
              fVar203 = fVar203 * fStack_58c +
                        fVar200 * fVar303 + fVar199 * fVar319 + fVar175 * fVar333;
              fVar199 = fVar355 - (fVar210 + fVar210);
              fVar175 = fVar210 - (fVar355 + fVar355);
              fVar207 = fVar210 * local_598 +
                        fVar199 * fVar273 + fVar175 * fVar312 + fVar274 * fVar355;
              fVar289 = fVar210 * fStack_594 +
                        fVar199 * fVar288 + fVar175 * fVar314 + fVar275 * fVar355;
              fVar248 = fVar210 * fStack_590 +
                        fVar199 * fVar293 + fVar175 * fVar317 + fVar276 * fVar355;
              fVar199 = (fVar365 * dir.field_0.m128[0] + 0.0) -
                        (fVar202 * local_598 +
                        fVar227 * fVar273 + fVar206 * fVar312 + fVar229 * fVar274);
              fVar200 = (fVar365 * dir.field_0.m128[1] + 0.0) -
                        (fVar202 * fStack_594 +
                        fVar227 * fVar288 + fVar206 * fVar314 + fVar229 * fVar275);
              fVar227 = (fVar365 * dir.field_0.m128[2] + 0.0) -
                        (fVar202 * fStack_590 +
                        fVar227 * fVar293 + fVar206 * fVar317 + fVar229 * fVar276);
              fVar229 = (fVar365 * dir.field_0.m128[3] + 0.0) - fVar205;
              fVar175 = fVar200 * fVar200;
              fVar202 = fVar227 * fVar227;
              fVar210 = fVar229 * fVar229;
              auVar286._0_4_ = fVar175 + fVar199 * fVar199 + fVar202;
              auVar286._4_4_ = fVar175 + fVar175 + fVar210;
              auVar286._8_4_ = fVar175 + fVar202 + fVar202;
              auVar286._12_4_ = fVar175 + fVar210 + fVar210;
              fVar175 = fVar172;
              if (fVar172 <= fVar177) {
                fVar175 = fVar177;
              }
              fVar202 = fVar246 * fVar246 + fVar204 * fVar204 + fVar278 * fVar278;
              auVar77 = ZEXT416((uint)fVar202);
              auVar232 = rsqrtss(ZEXT416((uint)fVar202),auVar77);
              fVar177 = auVar232._0_4_;
              fVar210 = fVar177 * 1.5 - fVar177 * fVar177 * fVar202 * 0.5 * fVar177;
              fVar249 = fVar204 * fVar210;
              fVar298 = fVar246 * fVar210;
              fVar304 = fVar278 * fVar210;
              fVar313 = fVar203 * fVar210;
              fVar315 = fVar248 * fVar278 + fVar289 * fVar246 + fVar207 * fVar204;
              auVar77 = rcpss(auVar77,auVar77);
              fVar177 = (2.0 - fVar202 * auVar77._0_4_) * auVar77._0_4_;
              fVar206 = fVar200 * fVar298;
              fVar209 = fVar227 * fVar304;
              fVar294 = fVar229 * fVar313;
              fVar316 = fVar206 + fVar199 * fVar249 + fVar209;
              fVar290 = fVar206 + fVar206 + fVar294;
              fVar209 = fVar206 + fVar209 + fVar209;
              fVar294 = fVar206 + fVar294 + fVar294;
              fVar295 = (SQRT(auVar286._0_4_) + 1.0) * (fVar172 / SQRT(fVar202)) +
                        SQRT(auVar286._0_4_) * fVar172 + fVar175;
              fVar206 = dir.field_0.m128[3] * fVar313;
              fVar313 = fVar313 * -fVar203;
              fVar207 = fVar304 * -fVar278 + fVar298 * -fVar246 + fVar249 * -fVar204 +
                        fVar177 * (fVar202 * fVar248 - fVar315 * fVar278) * fVar210 * fVar227 +
                        fVar177 * (fVar202 * fVar289 - fVar315 * fVar246) * fVar210 * fVar200 +
                        fVar177 * (fVar202 * fVar207 - fVar315 * fVar204) * fVar210 * fVar199;
              fVar210 = dir.field_0.m128[2] * fVar304 +
                        dir.field_0.m128[1] * fVar298 + dir.field_0.m128[0] * fVar249;
              fVar177 = auVar286._0_4_ - fVar316 * fVar316;
              auVar112._0_8_ = CONCAT44(auVar286._4_4_ - fVar290 * fVar290,fVar177);
              auVar112._8_4_ = auVar286._8_4_ - fVar209 * fVar209;
              auVar112._12_4_ = auVar286._12_4_ - fVar294 * fVar294;
              fVar294 = -fVar203 * fVar229;
              local_698 = CONCAT44(fVar313,fVar207);
              fVar289 = dir.field_0.m128[0] * fVar199;
              fVar248 = dir.field_0.m128[1] * fVar200;
              fVar209 = dir.field_0.m128[2] * fVar227;
              fVar229 = dir.field_0.m128[3] * fVar229;
              auVar150._8_4_ = auVar112._8_4_;
              auVar150._0_8_ = auVar112._0_8_;
              auVar150._12_4_ = auVar112._12_4_;
              auVar77 = rsqrtss(auVar150,auVar112);
              fVar202 = auVar77._0_4_;
              fVar202 = fVar202 * 1.5 - fVar202 * fVar202 * fVar177 * 0.5 * fVar202;
              if (fVar177 < 0.0) {
                fVar177 = sqrtf(fVar177);
                uVar60 = extraout_RAX;
                uVar64 = extraout_RDX;
              }
              else {
                fVar177 = SQRT(fVar177);
              }
              fVar177 = fVar177 - fVar205;
              fVar205 = ((-fVar278 * fVar227 + -fVar246 * fVar200 + -fVar204 * fVar199) -
                        fVar316 * fVar207) * fVar202 - fVar203;
              fVar202 = ((fVar209 + fVar248 + fVar289) - fVar316 * fVar210) * fVar202;
              auVar191._0_4_ = fVar207 * fVar202 - fVar210 * fVar205;
              auVar218._8_4_ = -fVar294;
              auVar218._0_8_ = CONCAT44(fVar294,fVar205) ^ 0x8000000000000000;
              auVar218._12_4_ = fVar229;
              auVar217._8_8_ = auVar218._8_8_;
              auVar217._0_8_ = CONCAT44(fVar202,fVar205) ^ 0x80000000;
              auVar191._4_4_ = auVar191._0_4_;
              auVar191._8_4_ = auVar191._0_4_;
              auVar191._12_4_ = auVar191._0_4_;
              auVar77 = divps(auVar217,auVar191);
              auVar270._8_4_ = fVar313;
              auVar270._0_8_ = local_698;
              auVar270._12_4_ = -fVar206;
              auVar269._8_8_ = auVar270._8_8_;
              auVar269._0_8_ = CONCAT44(fVar210,fVar207) ^ 0x8000000000000000;
              auVar232 = divps(auVar269,auVar191);
              fVar365 = fVar365 - (fVar177 * auVar232._0_4_ + fVar316 * auVar77._0_4_);
              fVar355 = fVar355 - (fVar177 * auVar232._4_4_ + fVar316 * auVar77._4_4_);
              if ((ABS(fVar316) < fVar295) &&
                 (ABS(fVar177) < auVar233._12_4_ * 1.9073486e-06 + fVar175 + fVar295)) {
                bVar69 = uVar68 < 5;
                fVar365 = fVar208 + fVar365;
                if ((fVar365 < fVar164) ||
                   (fVar172 = *(float *)(ray + k * 4 + 0x80), fVar172 < fVar365)) {
                  uVar60 = 0;
                }
                else {
                  uVar60 = 0;
                  if ((0.0 <= fVar355) && (fVar355 <= 1.0)) {
                    auVar77 = rsqrtss(auVar286,auVar286);
                    fVar175 = auVar77._0_4_;
                    pGVar9 = (context->scene->geometries).items[local_5e0].ptr;
                    uVar64 = local_5e0;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                      uVar60 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (uVar60 = CONCAT71((int7)((ulong)context->args >> 8),1),
                            pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      fVar175 = fVar175 * 1.5 + fVar175 * fVar175 * auVar286._0_4_ * -0.5 * fVar175;
                      fVar199 = fVar199 * fVar175;
                      fVar200 = fVar200 * fVar175;
                      fVar227 = fVar227 * fVar175;
                      fVar175 = fVar203 * fVar199 + fVar204;
                      fVar177 = fVar203 * fVar200 + fVar246;
                      fVar202 = fVar203 * fVar227 + fVar278;
                      fVar205 = fVar200 * fVar204 - fVar246 * fVar199;
                      fVar210 = fVar227 * fVar246 - fVar278 * fVar200;
                      fVar199 = fVar199 * fVar278 - fVar204 * fVar227;
                      local_308 = fVar210 * fVar177 - fVar199 * fVar175;
                      local_328._4_4_ = fVar199 * fVar202 - fVar205 * fVar177;
                      local_318 = fVar205 * fVar175 - fVar210 * fVar202;
                      local_328._0_4_ = local_328._4_4_;
                      fStack_320 = (float)local_328._4_4_;
                      fStack_31c = (float)local_328._4_4_;
                      fStack_314 = local_318;
                      fStack_310 = local_318;
                      fStack_30c = local_318;
                      fStack_304 = local_308;
                      fStack_300 = local_308;
                      fStack_2fc = local_308;
                      local_2f8 = fVar355;
                      fStack_2f4 = fVar355;
                      fStack_2f0 = fVar355;
                      fStack_2ec = fVar355;
                      local_2e8 = 0;
                      uStack_2e4 = 0;
                      uStack_2e0 = 0;
                      uStack_2dc = 0;
                      local_2d8 = CONCAT44(uVar5,uVar5);
                      uStack_2d0 = CONCAT44(uVar5,uVar5);
                      local_2c8 = CONCAT44(uVar70,uVar70);
                      uStack_2c0 = CONCAT44(uVar70,uVar70);
                      local_2b8 = context->user->instID[0];
                      uStack_2b4 = local_2b8;
                      uStack_2b0 = local_2b8;
                      uStack_2ac = local_2b8;
                      local_2a8 = context->user->instPrimID[0];
                      uStack_2a4 = local_2a8;
                      uStack_2a0 = local_2a8;
                      uStack_29c = local_2a8;
                      *(float *)(ray + k * 4 + 0x80) = fVar365;
                      local_5f8 = *(undefined1 (*) [16])
                                   (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                      args.valid = (int *)local_5f8;
                      args.geometryUserPtr = pGVar9->userPtr;
                      args.context = context->user;
                      args.ray = (RTCRayN *)ray;
                      args.hit = (RTCHitN *)local_328;
                      args.N = 4;
                      p_Var10 = pGVar9->occlusionFilterN;
                      auVar385._8_8_ = &local_2b8;
                      auVar385._0_8_ = p_Var10;
                      if (p_Var10 != (RTCFilterFunctionN)0x0) {
                        auVar385 = (*p_Var10)(&args);
                      }
                      uVar64 = auVar385._8_8_;
                      auVar151._0_4_ = -(uint)(local_5f8._0_4_ == 0);
                      auVar151._4_4_ = -(uint)(local_5f8._4_4_ == 0);
                      auVar151._8_4_ = -(uint)(local_5f8._8_4_ == 0);
                      auVar151._12_4_ = -(uint)(local_5f8._12_4_ == 0);
                      uVar55 = movmskps(auVar385._0_4_,auVar151);
                      pRVar59 = (RTCRayN *)(ulong)(uVar55 ^ 0xf);
                      if ((uVar55 ^ 0xf) == 0) {
                        auVar151 = auVar151 ^ _DAT_01f46b70;
                      }
                      else {
                        p_Var10 = context->args->filter;
                        if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var10)(&args);
                          uVar64 = extraout_RDX_00;
                        }
                        auVar113._0_4_ = -(uint)(local_5f8._0_4_ == 0);
                        auVar113._4_4_ = -(uint)(local_5f8._4_4_ == 0);
                        auVar113._8_4_ = -(uint)(local_5f8._8_4_ == 0);
                        auVar113._12_4_ = -(uint)(local_5f8._12_4_ == 0);
                        auVar151 = auVar113 ^ _DAT_01f46b70;
                        *(undefined1 (*) [16])(args.ray + 0x80) =
                             ~auVar113 & _DAT_01f45a40 |
                             *(undefined1 (*) [16])(args.ray + 0x80) & auVar113;
                        pRVar59 = args.ray;
                      }
                      auVar152._0_4_ = auVar151._0_4_ << 0x1f;
                      auVar152._4_4_ = auVar151._4_4_ << 0x1f;
                      auVar152._8_4_ = auVar151._8_4_ << 0x1f;
                      auVar152._12_4_ = auVar151._12_4_ << 0x1f;
                      iVar53 = movmskps((int)pRVar59,auVar152);
                      uVar60 = CONCAT71((int7)(CONCAT44((int)((ulong)pRVar59 >> 0x20),iVar53) >> 8),
                                        iVar53 != 0);
                      if (iVar53 == 0) {
                        *(float *)(ray + k * 4 + 0x80) = fVar172;
                      }
                    }
                  }
                }
                goto LAB_002c276c;
              }
            }
            bVar69 = false;
LAB_002c276c:
            bVar65 = bVar65 | bVar69 & (byte)uVar60;
            fVar360 = *(float *)(ray + k * 4 + 0x80);
            auVar110._0_4_ = -(uint)(local_5b8 <= fVar360) & local_338._0_4_;
            auVar110._4_4_ = -(uint)(fStack_5b4 <= fVar360) & local_338._4_4_;
            auVar110._8_4_ = -(uint)(fStack_5b0 <= fVar360) & local_338._8_4_;
            auVar110._12_4_ = -(uint)(fStack_5ac <= fVar360) & local_338._12_4_;
          }
          auVar168._0_4_ = -(uint)(aVar285.v[0] + local_5c8 <= fVar360) & uVar280;
          auVar168._4_4_ = -(uint)(aVar285.v[1] + fStack_5c4 <= fVar360) & uVar292;
          auVar168._8_4_ = -(uint)(aVar285.v[2] + fStack_5c0 <= fVar360) & uVar297;
          auVar168._12_4_ = -(uint)(aVar285.v[3] + fStack_5bc <= fVar360) & uVar302;
          auVar114._0_4_ =
               -(uint)((int)local_6dc <
                      ((int)((-(uint)(0.3 <= ABS((float)local_688._0_4_ * fVar163 +
                                                 fVar352 * (float)local_6c8._4_4_ +
                                                 fVar179 * fVar165)) & auVar187._0_4_) << 0x1f) >>
                      0x1f) + 4);
          auVar114._4_4_ =
               -(uint)((int)local_6dc <
                      ((int)((-(uint)(0.3 <= ABS((float)local_688._4_4_ * fVar163 +
                                                 fVar361 * (float)local_6c8._4_4_ +
                                                 fVar180 * fVar165)) & auVar187._4_4_) << 0x1f) >>
                      0x1f) + 4);
          auVar114._8_4_ =
               -(uint)((int)local_6dc <
                      ((int)((-(uint)(0.3 <= ABS(fStack_680 * fVar163 +
                                                 fVar373 * (float)local_6c8._4_4_ +
                                                 fVar224 * fVar165)) & auVar187._8_4_) << 0x1f) >>
                      0x1f) + 4);
          auVar114._12_4_ =
               -(uint)((int)local_6dc <
                      ((int)((-(uint)(0.3 <= ABS(fStack_67c * fVar163 +
                                                 fVar176 * (float)local_6c8._4_4_ +
                                                 fVar226 * fVar165)) & auVar187._12_4_) << 0x1f) >>
                      0x1f) + 4);
          auVar115 = ~auVar114 & auVar168;
          local_5a8 = tp1.lower.field_0;
          local_5b8 = local_5c8 + tp1.lower.field_0.v[0];
          fStack_5b4 = fStack_5c4 + tp1.lower.field_0.v[1];
          fStack_5b0 = fStack_5c0 + tp1.lower.field_0.v[2];
          fStack_5ac = fStack_5bc + tp1.lower.field_0.v[3];
          while( true ) {
            local_348 = auVar115;
            iVar53 = movmskps((int)lVar62,auVar115);
            if (iVar53 == 0) break;
            auVar232 = ~auVar115 & _DAT_01f45a30 | auVar115 & (undefined1  [16])local_5a8;
            auVar192._4_4_ = auVar232._0_4_;
            auVar192._0_4_ = auVar232._4_4_;
            auVar192._8_4_ = auVar232._12_4_;
            auVar192._12_4_ = auVar232._8_4_;
            auVar77 = minps(auVar192,auVar232);
            auVar153._0_8_ = auVar77._8_8_;
            auVar153._8_4_ = auVar77._0_4_;
            auVar153._12_4_ = auVar77._4_4_;
            auVar77 = minps(auVar153,auVar77);
            auVar154._0_8_ =
                 CONCAT44(-(uint)(auVar77._4_4_ == auVar232._4_4_) & auVar115._4_4_,
                          -(uint)(auVar77._0_4_ == auVar232._0_4_) & auVar115._0_4_);
            auVar154._8_4_ = -(uint)(auVar77._8_4_ == auVar232._8_4_) & auVar115._8_4_;
            auVar154._12_4_ = -(uint)(auVar77._12_4_ == auVar232._12_4_) & auVar115._12_4_;
            iVar53 = movmskps(iVar53,auVar154);
            if (iVar53 != 0) {
              auVar115._8_4_ = auVar154._8_4_;
              auVar115._0_8_ = auVar154._0_8_;
              auVar115._12_4_ = auVar154._12_4_;
            }
            uVar56 = movmskps(iVar53,auVar115);
            uVar68 = CONCAT44((int)((ulong)lVar62 >> 0x20),uVar56);
            lVar62 = 0;
            if (uVar68 != 0) {
              for (; (uVar68 >> lVar62 & 1) == 0; lVar62 = lVar62 + 1) {
              }
            }
            *(undefined4 *)(local_348 + lVar62 * 4) = 0;
            auVar24._4_4_ = fStack_594;
            auVar24._0_4_ = local_598;
            auVar24._8_4_ = fStack_590;
            auVar24._12_4_ = fStack_58c;
            auVar30._4_4_ = fVar288;
            auVar30._0_4_ = fVar273;
            auVar30._8_4_ = fVar293;
            auVar30._12_4_ = fVar303;
            auVar232 = minps(auVar24,auVar30);
            auVar233 = maxps(auVar24,auVar30);
            auVar28._4_4_ = fVar314;
            auVar28._0_4_ = fVar312;
            auVar28._8_4_ = fVar317;
            auVar28._12_4_ = fVar319;
            auVar26._4_4_ = fVar275;
            auVar26._0_4_ = fVar274;
            auVar26._8_4_ = fVar276;
            auVar26._12_4_ = fVar333;
            auVar77 = minps(auVar28,auVar26);
            auVar232 = minps(auVar232,auVar77);
            auVar77 = maxps(auVar28,auVar26);
            auVar233 = maxps(auVar233,auVar77);
            auVar193._0_8_ = auVar232._0_8_ & 0x7fffffff7fffffff;
            auVar193._8_4_ = auVar232._8_4_ & 0x7fffffff;
            auVar193._12_4_ = auVar232._12_4_ & 0x7fffffff;
            auVar116._0_8_ = auVar233._0_8_ & 0x7fffffff7fffffff;
            auVar116._8_4_ = auVar233._8_4_ & 0x7fffffff;
            auVar116._12_4_ = ABS(auVar233._12_4_);
            auVar77 = maxps(auVar193,auVar116);
            fVar352 = auVar77._4_4_;
            if (auVar77._4_4_ <= auVar77._0_4_) {
              fVar352 = auVar77._0_4_;
            }
            auVar194._8_8_ = auVar77._8_8_;
            auVar194._0_8_ = auVar77._8_8_;
            if (auVar77._8_4_ <= fVar352) {
              auVar194._0_4_ = fVar352;
            }
            fVar361 = auVar194._0_4_ * 1.9073486e-06;
            fVar352 = local_118[lVar62];
            fVar355 = tp1.upper.field_0.v[lVar62];
            for (uVar68 = 0; uVar68 != 5; uVar68 = uVar68 + 1) {
              fVar373 = SQRT(fVar178) * 1.9073486e-06 * fVar355;
              fVar175 = 1.0 - fVar352;
              fVar177 = fVar352 * fVar175;
              fVar365 = fVar175 * fVar175 * fVar175;
              fVar210 = fVar352 * fVar352 * fVar352;
              fVar172 = fVar365 * 0.16666667;
              fVar205 = (fVar175 * fVar177 * 12.0 + fVar177 * fVar352 * 6.0 +
                        fVar365 * 4.0 + fVar210) * 0.16666667;
              fVar199 = (fVar177 * fVar352 * 12.0 + fVar175 * fVar177 * 6.0 +
                        fVar210 * 4.0 + fVar365) * 0.16666667;
              fVar210 = fVar210 * 0.16666667;
              fVar176 = fVar172 * fStack_58c +
                        fVar205 * fVar303 + fVar199 * fVar319 + fVar210 * fVar333;
              fVar179 = -fVar175 * fVar175 * 0.5;
              fVar202 = (-fVar352 * fVar352 - fVar177 * 4.0) * 0.5;
              fVar177 = (fVar175 * fVar175 + fVar177 * 4.0) * 0.5;
              fVar365 = fVar352 * fVar352 * 0.5;
              fVar180 = fVar179 * local_598 +
                        fVar202 * fVar273 + fVar177 * fVar312 + fVar365 * fVar274;
              fVar224 = fVar179 * fStack_594 +
                        fVar202 * fVar288 + fVar177 * fVar314 + fVar365 * fVar275;
              fVar226 = fVar179 * fStack_590 +
                        fVar202 * fVar293 + fVar177 * fVar317 + fVar365 * fVar276;
              fVar179 = fVar179 * fStack_58c +
                        fVar202 * fVar303 + fVar177 * fVar319 + fVar365 * fVar333;
              fVar177 = fVar352 - (fVar175 + fVar175);
              fVar365 = fVar175 - (fVar352 + fVar352);
              fVar200 = fVar175 * local_598 +
                        fVar177 * fVar273 + fVar365 * fVar312 + fVar274 * fVar352;
              fVar227 = fVar175 * fStack_594 +
                        fVar177 * fVar288 + fVar365 * fVar314 + fVar275 * fVar352;
              fVar229 = fVar175 * fStack_590 +
                        fVar177 * fVar293 + fVar365 * fVar317 + fVar276 * fVar352;
              fVar177 = (fVar355 * dir.field_0.m128[0] + 0.0) -
                        (fVar172 * local_598 +
                        fVar205 * fVar273 + fVar199 * fVar312 + fVar210 * fVar274);
              fVar202 = (fVar355 * dir.field_0.m128[1] + 0.0) -
                        (fVar172 * fStack_594 +
                        fVar205 * fVar288 + fVar199 * fVar314 + fVar210 * fVar275);
              fVar205 = (fVar355 * dir.field_0.m128[2] + 0.0) -
                        (fVar172 * fStack_590 +
                        fVar205 * fVar293 + fVar199 * fVar317 + fVar210 * fVar276);
              fVar210 = (fVar355 * dir.field_0.m128[3] + 0.0) - fVar176;
              fVar365 = fVar202 * fVar202;
              fVar172 = fVar205 * fVar205;
              fVar175 = fVar210 * fVar210;
              fVar199 = fVar365 + fVar177 * fVar177 + fVar172;
              fVar203 = fVar365 + fVar365 + fVar175;
              fVar172 = fVar365 + fVar172 + fVar172;
              fVar175 = fVar365 + fVar175 + fVar175;
              fVar365 = fVar361;
              if (fVar361 <= fVar373) {
                fVar365 = fVar373;
              }
              fVar204 = fVar224 * fVar224 + fVar180 * fVar180 + fVar226 * fVar226;
              auVar77 = ZEXT416((uint)fVar204);
              auVar232 = rsqrtss(ZEXT416((uint)fVar204),auVar77);
              fVar373 = auVar232._0_4_;
              fVar246 = fVar373 * 1.5 - fVar373 * fVar373 * fVar204 * 0.5 * fVar373;
              fVar209 = fVar180 * fVar246;
              fVar294 = fVar224 * fVar246;
              fVar249 = fVar226 * fVar246;
              fVar298 = fVar179 * fVar246;
              fVar304 = fVar229 * fVar226 + fVar227 * fVar224 + fVar200 * fVar180;
              auVar77 = rcpss(auVar77,auVar77);
              fVar373 = (2.0 - fVar204 * auVar77._0_4_) * auVar77._0_4_;
              fVar278 = fVar202 * fVar294;
              fVar206 = fVar205 * fVar249;
              fVar207 = fVar210 * fVar298;
              fVar289 = fVar278 + fVar177 * fVar209 + fVar206;
              fVar248 = fVar278 + fVar278 + fVar207;
              fVar206 = fVar278 + fVar206 + fVar206;
              fVar207 = fVar278 + fVar207 + fVar207;
              fVar313 = (SQRT(fVar199) + 1.0) * (fVar361 / SQRT(fVar204)) +
                        SQRT(fVar199) * fVar361 + fVar365;
              fVar278 = dir.field_0.m128[3] * fVar298;
              fVar298 = fVar298 * -fVar179;
              fVar229 = fVar249 * -fVar226 + fVar294 * -fVar224 + fVar209 * -fVar180 +
                        fVar373 * (fVar204 * fVar229 - fVar304 * fVar226) * fVar246 * fVar205 +
                        fVar373 * (fVar204 * fVar227 - fVar304 * fVar224) * fVar246 * fVar202 +
                        fVar373 * (fVar204 * fVar200 - fVar304 * fVar180) * fVar246 * fVar177;
              fVar227 = dir.field_0.m128[2] * fVar249 +
                        dir.field_0.m128[1] * fVar294 + dir.field_0.m128[0] * fVar209;
              fVar373 = fVar199 - fVar289 * fVar289;
              fVar200 = fVar203 - fVar248 * fVar248;
              fVar248 = fVar172 - fVar206 * fVar206;
              fVar209 = fVar175 - fVar207 * fVar207;
              fVar207 = -fVar179 * fVar210;
              local_698 = CONCAT44(fVar298,fVar229);
              fVar204 = dir.field_0.m128[0] * fVar177;
              fVar246 = dir.field_0.m128[1] * fVar202;
              fVar206 = dir.field_0.m128[2] * fVar205;
              fVar210 = dir.field_0.m128[3] * fVar210;
              auVar155._4_4_ = fVar200;
              auVar155._0_4_ = fVar373;
              auVar155._8_4_ = fVar248;
              auVar155._12_4_ = fVar209;
              auVar22._4_4_ = fVar200;
              auVar22._0_4_ = fVar373;
              auVar22._8_4_ = fVar248;
              auVar22._12_4_ = fVar209;
              auVar77 = rsqrtss(auVar155,auVar22);
              fVar200 = auVar77._0_4_;
              fVar200 = fVar200 * 1.5 - fVar200 * fVar200 * fVar373 * 0.5 * fVar200;
              if (fVar373 < 0.0) {
                fVar373 = sqrtf(fVar373);
                lVar62 = extraout_RAX_00;
                uVar64 = extraout_RDX_01;
              }
              else {
                fVar373 = SQRT(fVar373);
              }
              fVar373 = fVar373 - fVar176;
              fVar176 = ((-fVar226 * fVar205 + -fVar224 * fVar202 + -fVar180 * fVar177) -
                        fVar289 * fVar229) * fVar200 - fVar179;
              fVar200 = ((fVar206 + fVar246 + fVar204) - fVar289 * fVar227) * fVar200;
              auVar195._0_4_ = fVar229 * fVar200 - fVar227 * fVar176;
              auVar220._8_4_ = -fVar207;
              auVar220._0_8_ = CONCAT44(fVar207,fVar176) ^ 0x8000000000000000;
              auVar220._12_4_ = fVar210;
              auVar219._8_8_ = auVar220._8_8_;
              auVar219._0_8_ = CONCAT44(fVar200,fVar176) ^ 0x80000000;
              auVar195._4_4_ = auVar195._0_4_;
              auVar195._8_4_ = auVar195._0_4_;
              auVar195._12_4_ = auVar195._0_4_;
              auVar77 = divps(auVar219,auVar195);
              auVar240._8_4_ = fVar298;
              auVar240._0_8_ = local_698;
              auVar240._12_4_ = -fVar278;
              auVar239._8_8_ = auVar240._8_8_;
              auVar239._0_8_ = CONCAT44(fVar227,fVar229) ^ 0x8000000000000000;
              auVar232 = divps(auVar239,auVar195);
              fVar355 = fVar355 - (fVar373 * auVar232._0_4_ + fVar289 * auVar77._0_4_);
              fVar352 = fVar352 - (fVar373 * auVar232._4_4_ + fVar289 * auVar77._4_4_);
              if ((ABS(fVar289) < fVar313) &&
                 (ABS(fVar373) < auVar233._12_4_ * 1.9073486e-06 + fVar365 + fVar313)) {
                bVar69 = uVar68 < 5;
                fVar355 = fVar208 + fVar355;
                if ((fVar355 < fVar164) ||
                   (fVar361 = *(float *)(ray + k * 4 + 0x80), fVar361 < fVar355)) {
                  lVar62 = 0;
                }
                else {
                  lVar62 = 0;
                  if ((0.0 <= fVar352) && (fVar352 <= 1.0)) {
                    auVar169._4_4_ = fVar203;
                    auVar169._0_4_ = fVar199;
                    auVar169._8_4_ = fVar172;
                    auVar169._12_4_ = fVar175;
                    auVar17._4_4_ = fVar203;
                    auVar17._0_4_ = fVar199;
                    auVar17._8_4_ = fVar172;
                    auVar17._12_4_ = fVar175;
                    auVar77 = rsqrtss(auVar169,auVar17);
                    fVar365 = auVar77._0_4_;
                    pGVar9 = (context->scene->geometries).items[local_5e0].ptr;
                    uVar64 = local_5e0;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                      lVar62 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (lVar62 = CONCAT71((int7)((ulong)context->args >> 8),1),
                            pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      fVar365 = fVar365 * 1.5 + fVar365 * fVar365 * fVar199 * -0.5 * fVar365;
                      fVar177 = fVar177 * fVar365;
                      fVar202 = fVar202 * fVar365;
                      fVar205 = fVar205 * fVar365;
                      fVar365 = fVar179 * fVar177 + fVar180;
                      fVar373 = fVar179 * fVar202 + fVar224;
                      fVar172 = fVar179 * fVar205 + fVar226;
                      fVar176 = fVar202 * fVar180 - fVar224 * fVar177;
                      fVar175 = fVar205 * fVar224 - fVar226 * fVar202;
                      fVar177 = fVar177 * fVar226 - fVar180 * fVar205;
                      local_308 = fVar175 * fVar373 - fVar177 * fVar365;
                      local_328._4_4_ = fVar177 * fVar172 - fVar176 * fVar373;
                      local_318 = fVar176 * fVar365 - fVar175 * fVar172;
                      local_328._0_4_ = local_328._4_4_;
                      fStack_320 = (float)local_328._4_4_;
                      fStack_31c = (float)local_328._4_4_;
                      fStack_314 = local_318;
                      fStack_310 = local_318;
                      fStack_30c = local_318;
                      fStack_304 = local_308;
                      fStack_300 = local_308;
                      fStack_2fc = local_308;
                      local_2f8 = fVar352;
                      fStack_2f4 = fVar352;
                      fStack_2f0 = fVar352;
                      fStack_2ec = fVar352;
                      local_2e8 = 0;
                      uStack_2e4 = 0;
                      uStack_2e0 = 0;
                      uStack_2dc = 0;
                      local_2d8 = CONCAT44(uVar5,uVar5);
                      uStack_2d0 = CONCAT44(uVar5,uVar5);
                      local_2c8 = CONCAT44(uVar70,uVar70);
                      uStack_2c0 = CONCAT44(uVar70,uVar70);
                      local_2b8 = context->user->instID[0];
                      uStack_2b4 = local_2b8;
                      uStack_2b0 = local_2b8;
                      uStack_2ac = local_2b8;
                      local_2a8 = context->user->instPrimID[0];
                      uStack_2a4 = local_2a8;
                      uStack_2a0 = local_2a8;
                      uStack_29c = local_2a8;
                      *(float *)(ray + k * 4 + 0x80) = fVar355;
                      local_5f8 = *(undefined1 (*) [16])
                                   (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                      args.valid = (int *)local_5f8;
                      args.geometryUserPtr = pGVar9->userPtr;
                      args.context = context->user;
                      args.ray = (RTCRayN *)ray;
                      args.hit = (RTCHitN *)local_328;
                      args.N = 4;
                      p_Var10 = pGVar9->occlusionFilterN;
                      auVar386._8_8_ = &local_2b8;
                      auVar386._0_8_ = p_Var10;
                      if (p_Var10 != (RTCFilterFunctionN)0x0) {
                        auVar386 = (*p_Var10)(&args);
                      }
                      uVar64 = auVar386._8_8_;
                      auVar156._0_4_ = -(uint)(local_5f8._0_4_ == 0);
                      auVar156._4_4_ = -(uint)(local_5f8._4_4_ == 0);
                      auVar156._8_4_ = -(uint)(local_5f8._8_4_ == 0);
                      auVar156._12_4_ = -(uint)(local_5f8._12_4_ == 0);
                      uVar280 = movmskps(auVar386._0_4_,auVar156);
                      pRVar59 = (RTCRayN *)(ulong)(uVar280 ^ 0xf);
                      if ((uVar280 ^ 0xf) == 0) {
                        auVar156 = auVar156 ^ _DAT_01f46b70;
                      }
                      else {
                        p_Var10 = context->args->filter;
                        if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var10)(&args);
                          uVar64 = extraout_RDX_02;
                        }
                        auVar117._0_4_ = -(uint)(local_5f8._0_4_ == 0);
                        auVar117._4_4_ = -(uint)(local_5f8._4_4_ == 0);
                        auVar117._8_4_ = -(uint)(local_5f8._8_4_ == 0);
                        auVar117._12_4_ = -(uint)(local_5f8._12_4_ == 0);
                        auVar156 = auVar117 ^ _DAT_01f46b70;
                        *(undefined1 (*) [16])(args.ray + 0x80) =
                             ~auVar117 & _DAT_01f45a40 |
                             *(undefined1 (*) [16])(args.ray + 0x80) & auVar117;
                        pRVar59 = args.ray;
                      }
                      auVar157._0_4_ = auVar156._0_4_ << 0x1f;
                      auVar157._4_4_ = auVar156._4_4_ << 0x1f;
                      auVar157._8_4_ = auVar156._8_4_ << 0x1f;
                      auVar157._12_4_ = auVar156._12_4_ << 0x1f;
                      iVar53 = movmskps((int)pRVar59,auVar157);
                      lVar62 = CONCAT71((int7)(CONCAT44((int)((ulong)pRVar59 >> 0x20),iVar53) >> 8),
                                        iVar53 != 0);
                      if (iVar53 == 0) {
                        *(float *)(ray + k * 4 + 0x80) = fVar361;
                      }
                    }
                  }
                }
                goto LAB_002c3218;
              }
            }
            bVar69 = false;
LAB_002c3218:
            bVar65 = bVar65 | bVar69 & (byte)lVar62;
            fVar360 = *(float *)(ray + k * 4 + 0x80);
            auVar115._0_4_ = -(uint)(local_5b8 <= fVar360) & local_348._0_4_;
            auVar115._4_4_ = -(uint)(fStack_5b4 <= fVar360) & local_348._4_4_;
            auVar115._8_4_ = -(uint)(fStack_5b0 <= fVar360) & local_348._8_4_;
            auVar115._12_4_ = -(uint)(fStack_5ac <= fVar360) & local_348._12_4_;
          }
          auVar241._0_4_ = local_5d8._0_4_ & uVar71 & -(uint)(local_5c8 + fVar342 <= fVar360);
          auVar241._4_4_ = local_5d8._4_4_ & uVar72 & -(uint)(fStack_5c4 + fVar358 <= fVar360);
          auVar241._8_4_ = (uint)fStack_5d0 & uVar73 & -(uint)(fStack_5c0 + fVar369 <= fVar360);
          auVar241._12_4_ = (uint)fStack_5cc & uVar74 & -(uint)(fStack_5bc + fVar174 <= fVar360);
          auVar196._0_4_ =
               auVar114._0_4_ & auVar168._0_4_ &
               -(uint)(local_5c8 + tp1.lower.field_0.v[0] <= fVar360);
          auVar196._4_4_ =
               auVar114._4_4_ & auVar168._4_4_ &
               -(uint)(fStack_5c4 + tp1.lower.field_0.v[1] <= fVar360);
          auVar196._8_4_ =
               auVar114._8_4_ & auVar168._8_4_ &
               -(uint)(fStack_5c0 + tp1.lower.field_0.v[2] <= fVar360);
          auVar196._12_4_ =
               auVar114._12_4_ & auVar168._12_4_ &
               -(uint)(fStack_5bc + tp1.lower.field_0.v[3] <= fVar360);
          uVar71 = movmskps(0,auVar196 | auVar241);
          uVar60 = (ulong)uVar71;
          fVar335 = local_5c8;
          fVar339 = fStack_5c4;
          fVar344 = fStack_5c0;
          fVar354 = fStack_5bc;
          if (uVar71 != 0) {
            uVar60 = uVar63 * 0x30;
            stack[uVar63].valid.field_0 =
                 (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar196 | auVar241);
            auVar118._0_4_ = (uint)fVar342 & auVar241._0_4_;
            auVar118._4_4_ = (uint)fVar358 & auVar241._4_4_;
            auVar118._8_4_ = (uint)fVar369 & auVar241._8_4_;
            auVar118._12_4_ = (uint)fVar174 & auVar241._12_4_;
            auVar242._0_4_ = ~auVar241._0_4_ & tp1.lower.field_0.i[0];
            auVar242._4_4_ = ~auVar241._4_4_ & tp1.lower.field_0.i[1];
            auVar242._8_4_ = ~auVar241._8_4_ & tp1.lower.field_0.i[2];
            auVar242._12_4_ = ~auVar241._12_4_ & tp1.lower.field_0.i[3];
            stack[uVar63].tlower.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(auVar242 | auVar118);
            stack[uVar63].u0 = fVar171;
            stack[uVar63].u1 = fVar173;
            stack[uVar63].depth = local_6dc + 1;
            uVar63 = (ulong)((int)uVar63 + 1);
          }
        }
      }
    }
    do {
      uVar68 = uVar63;
      iVar53 = (int)uVar68;
      if (iVar53 == 0) {
        if (bVar65 != 0) goto LAB_002c380a;
        fVar124 = *(float *)(ray + k * 4 + 0x80);
        auVar161._4_4_ = -(uint)(fVar75 <= fVar124);
        auVar161._0_4_ = -(uint)(fVar201 <= fVar124);
        auVar161._8_4_ = -(uint)(fVar121 <= fVar124);
        auVar161._12_4_ = -(uint)(fVar122 <= fVar124);
        uVar70 = movmskps((int)uVar60,auVar161);
        uVar70 = (uint)uVar67 & uVar70;
        goto LAB_002c0eb4;
      }
      uVar63 = (ulong)(iVar53 - 1U);
      uVar60 = uVar63 * 0x30;
      fVar173 = stack[uVar63].tlower.field_0.v[0];
      fVar342 = stack[uVar63].tlower.field_0.v[1];
      fVar352 = stack[uVar63].tlower.field_0.v[2];
      fVar355 = stack[uVar63].tlower.field_0.v[3];
      fVar171 = *(float *)(ray + k * 4 + 0x80);
      aVar119._0_4_ = -(uint)(fVar335 + fVar173 <= fVar171) & stack[uVar63].valid.field_0.i[0];
      aVar119._4_4_ = -(uint)(fVar339 + fVar342 <= fVar171) & stack[uVar63].valid.field_0.i[1];
      aVar119.i[2] = -(uint)(fVar344 + fVar352 <= fVar171) & stack[uVar63].valid.field_0.i[2];
      aVar119.i[3] = -(uint)(fVar354 + fVar355 <= fVar171) & stack[uVar63].valid.field_0.i[3];
      _local_328 = aVar119;
      uVar71 = movmskps((int)uVar64,(undefined1  [16])aVar119);
      uVar64 = (ulong)uVar71;
    } while (uVar71 == 0);
    auVar158._0_4_ = (uint)fVar173 & aVar119._0_4_;
    auVar158._4_4_ = (uint)fVar342 & aVar119._4_4_;
    auVar158._8_4_ = (uint)fVar352 & aVar119.i[2];
    auVar158._12_4_ = (uint)fVar355 & aVar119.i[3];
    auVar170._0_8_ = CONCAT44(~aVar119._4_4_,~aVar119._0_4_) & 0x7f8000007f800000;
    auVar170._8_4_ = ~aVar119.i[2] & 0x7f800000;
    auVar170._12_4_ = ~aVar119.i[3] & 0x7f800000;
    auVar170 = auVar170 | auVar158;
    auVar197._4_4_ = auVar170._0_4_;
    auVar197._0_4_ = auVar170._4_4_;
    auVar197._8_4_ = auVar170._12_4_;
    auVar197._12_4_ = auVar170._8_4_;
    auVar77 = minps(auVar197,auVar170);
    auVar159._0_8_ = auVar77._8_8_;
    auVar159._8_4_ = auVar77._0_4_;
    auVar159._12_4_ = auVar77._4_4_;
    auVar77 = minps(auVar159,auVar77);
    auVar160._0_8_ =
         CONCAT44(-(uint)(auVar77._4_4_ == auVar170._4_4_) & aVar119._4_4_,
                  -(uint)(auVar77._0_4_ == auVar170._0_4_) & aVar119._0_4_);
    auVar160._8_4_ = -(uint)(auVar77._8_4_ == auVar170._8_4_) & aVar119.i[2];
    auVar160._12_4_ = -(uint)(auVar77._12_4_ == auVar170._12_4_) & aVar119.i[3];
    iVar61 = movmskps(iVar53 - 1U,auVar160);
    if (iVar61 != 0) {
      aVar119.i[2] = auVar160._8_4_;
      aVar119._0_8_ = auVar160._0_8_;
      aVar119.i[3] = auVar160._12_4_;
    }
    pSVar58 = stack + uVar63;
    uVar71 = movmskps(iVar61,(undefined1  [16])aVar119);
    lVar62 = 0;
    if (uVar71 != 0) {
      for (; (uVar71 >> lVar62 & 1) == 0; lVar62 = lVar62 + 1) {
      }
    }
    *(undefined4 *)(local_328 + lVar62 * 4) = 0;
    uVar6 = stack[uVar63].u0;
    uVar7 = stack[uVar63].u1;
    local_6dc = stack[uVar63].depth;
    iVar61 = movmskps(local_6dc,(undefined1  [16])_local_328);
    uVar64 = (ulong)(iVar53 - 1);
    if (iVar61 != 0) {
      uVar64 = uVar68;
    }
    (pSVar58->valid).field_0 = _local_328;
    fVar171 = (float)uVar7 - (float)uVar6;
    args.valid = (int *)CONCAT44(fVar171 * 0.33333334 + (float)uVar6,fVar171 * 0.0 + (float)uVar6);
    args.geometryUserPtr =
         (void *)CONCAT44(fVar171 * 1.0 + (float)uVar6,fVar171 * 0.6666667 + (float)uVar6);
    fVar171 = *(float *)((long)&args.valid + lVar62 * 4);
    fVar173 = *(float *)((long)&args.valid + lVar62 * 4 + 4);
    uVar63 = uVar64;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }